

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 *puVar1;
  float *pfVar2;
  Primitive *pPVar3;
  Primitive PVar4;
  undefined4 uVar5;
  Geometry *pGVar6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined3 uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined6 uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  LinearSpace3fa *pLVar35;
  byte bVar36;
  ulong uVar37;
  ulong uVar38;
  RTCFilterFunctionN p_Var39;
  RayHitK<4> *pRVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  uint uVar49;
  short sVar50;
  float fVar51;
  float fVar52;
  float fVar91;
  float fVar93;
  vfloat_impl<4> p00;
  undefined2 uVar90;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  float fVar92;
  float fVar94;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar95;
  float fVar115;
  float fVar116;
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float t1;
  float fVar117;
  float fVar128;
  float fVar129;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar130;
  float fVar134;
  float fVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar136;
  float fVar149;
  float fVar150;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar168;
  float fVar169;
  vfloat4 a;
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar174;
  float fVar175;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar176;
  float fVar198;
  float fVar200;
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  float fVar199;
  float fVar201;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar202;
  float fVar211;
  float fVar212;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar225;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar239;
  float fVar240;
  float fVar249;
  float fVar251;
  vfloat4 a_1;
  undefined1 auVar241 [16];
  float fVar253;
  undefined1 auVar244 [16];
  float fVar250;
  float fVar252;
  float fVar254;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar255;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar256 [16];
  float fVar263;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar264;
  float fVar265;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar269;
  float fVar270;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar280;
  float fVar283;
  float fVar284;
  undefined1 auVar281 [16];
  float fVar285;
  undefined1 auVar282 [16];
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3e8 [16];
  undefined1 (*local_3d0) [16];
  LinearSpace3fa *local_3c8;
  ulong local_3c0;
  RTCFilterFunctionNArguments local_3b8;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  uint auStack_2f8 [4];
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  undefined1 auVar86 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 uVar89;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  
  PVar4 = prim[1];
  uVar37 = (ulong)(byte)PVar4;
  pPVar3 = prim + uVar37 * 0x19 + 6;
  fVar129 = *(float *)(pPVar3 + 0xc);
  fVar130 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar129;
  fVar134 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar129;
  fVar135 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar129;
  fVar117 = *(float *)(ray + k * 4 + 0x40) * fVar129;
  fVar128 = *(float *)(ray + k * 4 + 0x50) * fVar129;
  fVar129 = *(float *)(ray + k * 4 + 0x60) * fVar129;
  uVar5 = *(undefined4 *)(prim + uVar37 * 4 + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar38;
  auVar158._12_2_ = uVar90;
  auVar158._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar38;
  auVar157._10_2_ = uVar90;
  auVar60._10_6_ = auVar157._10_6_;
  auVar60._8_2_ = uVar90;
  auVar60._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar20._4_8_ = auVar60._8_8_;
  auVar20._2_2_ = uVar90;
  auVar20._0_2_ = uVar90;
  fVar95 = (float)((int)sVar50 >> 8);
  fVar115 = (float)(auVar20._0_4_ >> 0x18);
  fVar116 = (float)(auVar60._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar37 * 5 + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar53._8_4_ = 0;
  auVar53._0_8_ = uVar38;
  auVar53._12_2_ = uVar90;
  auVar53._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar215._12_4_ = auVar53._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar38;
  auVar215._10_2_ = uVar90;
  auVar121._10_6_ = auVar215._10_6_;
  auVar121._8_2_ = uVar90;
  auVar121._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar21._4_8_ = auVar121._8_8_;
  auVar21._2_2_ = uVar90;
  auVar21._0_2_ = uVar90;
  fVar136 = (float)((int)sVar50 >> 8);
  fVar149 = (float)(auVar21._0_4_ >> 0x18);
  fVar150 = (float)(auVar121._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar37 * 6 + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar38;
  auVar56._12_2_ = uVar90;
  auVar56._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._8_2_ = 0;
  auVar55._0_8_ = uVar38;
  auVar55._10_2_ = uVar90;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._8_2_ = uVar90;
  auVar54._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar22._4_8_ = auVar54._8_8_;
  auVar22._2_2_ = uVar90;
  auVar22._0_2_ = uVar90;
  fVar170 = (float)((int)sVar50 >> 8);
  fVar174 = (float)(auVar22._0_4_ >> 0x18);
  fVar175 = (float)(auVar54._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar37 * 0xb + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar38;
  auVar59._12_2_ = uVar90;
  auVar59._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar38;
  auVar58._10_2_ = uVar90;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar90;
  auVar57._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar23._4_8_ = auVar57._8_8_;
  auVar23._2_2_ = uVar90;
  auVar23._0_2_ = uVar90;
  fVar51 = (float)((int)sVar50 >> 8);
  fVar91 = (float)(auVar23._0_4_ >> 0x18);
  fVar93 = (float)(auVar57._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar38;
  auVar154._12_2_ = uVar90;
  auVar154._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar38;
  auVar153._10_2_ = uVar90;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar90;
  auVar152._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar24._4_8_ = auVar152._8_8_;
  auVar24._2_2_ = uVar90;
  auVar24._0_2_ = uVar90;
  fVar151 = (float)((int)sVar50 >> 8);
  fVar168 = (float)(auVar24._0_4_ >> 0x18);
  fVar169 = (float)(auVar152._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + (uint)(byte)PVar4 * 0xc + uVar37 + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar38;
  auVar179._12_2_ = uVar90;
  auVar179._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar38;
  auVar178._10_2_ = uVar90;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar90;
  auVar177._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar25._4_8_ = auVar177._8_8_;
  auVar25._2_2_ = uVar90;
  auVar25._0_2_ = uVar90;
  fVar213 = (float)((int)sVar50 >> 8);
  fVar221 = (float)(auVar25._0_4_ >> 0x18);
  fVar222 = (float)(auVar177._8_4_ >> 0x18);
  uVar42 = (ulong)(uint)((int)(uVar37 * 9) * 2);
  uVar5 = *(undefined4 *)(prim + uVar42 + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar38;
  auVar182._12_2_ = uVar90;
  auVar182._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar38;
  auVar181._10_2_ = uVar90;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar90;
  auVar180._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar26._4_8_ = auVar180._8_8_;
  auVar26._2_2_ = uVar90;
  auVar26._0_2_ = uVar90;
  fVar202 = (float)((int)sVar50 >> 8);
  fVar211 = (float)(auVar26._0_4_ >> 0x18);
  fVar212 = (float)(auVar180._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar42 + uVar37 + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar38;
  auVar185._12_2_ = uVar90;
  auVar185._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar38;
  auVar184._10_2_ = uVar90;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar90;
  auVar183._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar27._4_8_ = auVar183._8_8_;
  auVar27._2_2_ = uVar90;
  auVar27._0_2_ = uVar90;
  fVar225 = (float)((int)sVar50 >> 8);
  fVar231 = (float)(auVar27._0_4_ >> 0x18);
  fVar234 = (float)(auVar183._8_4_ >> 0x18);
  uVar41 = (ulong)(uint)((int)(uVar37 * 5) << 2);
  uVar5 = *(undefined4 *)(prim + uVar41 + 6);
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar5 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar5));
  uVar89 = (undefined1)((uint)uVar5 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar5,(char)uVar5);
  uVar38 = CONCAT62(uVar19,sVar50);
  auVar243._8_4_ = 0;
  auVar243._0_8_ = uVar38;
  auVar243._12_2_ = uVar90;
  auVar243._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._8_2_ = 0;
  auVar242._0_8_ = uVar38;
  auVar242._10_2_ = uVar90;
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = uVar90;
  auVar241._0_8_ = uVar38;
  uVar90 = (undefined2)uVar19;
  auVar28._4_8_ = auVar241._8_8_;
  auVar28._2_2_ = uVar90;
  auVar28._0_2_ = uVar90;
  fVar52 = (float)((int)sVar50 >> 8);
  fVar92 = (float)(auVar28._0_4_ >> 0x18);
  fVar94 = (float)(auVar241._8_4_ >> 0x18);
  fVar255 = fVar117 * fVar95 + fVar128 * fVar136 + fVar129 * fVar170;
  fVar260 = fVar117 * fVar115 + fVar128 * fVar149 + fVar129 * fVar174;
  fVar261 = fVar117 * fVar116 + fVar128 * fVar150 + fVar129 * fVar175;
  fVar262 = fVar117 * (float)(auVar157._12_4_ >> 0x18) +
            fVar128 * (float)(auVar215._12_4_ >> 0x18) + fVar129 * (float)(auVar55._12_4_ >> 0x18);
  fVar239 = fVar117 * fVar51 + fVar128 * fVar151 + fVar129 * fVar213;
  fVar249 = fVar117 * fVar91 + fVar128 * fVar168 + fVar129 * fVar221;
  fVar251 = fVar117 * fVar93 + fVar128 * fVar169 + fVar129 * fVar222;
  fVar253 = fVar117 * (float)(auVar58._12_4_ >> 0x18) +
            fVar128 * (float)(auVar153._12_4_ >> 0x18) + fVar129 * (float)(auVar178._12_4_ >> 0x18);
  fVar176 = fVar117 * fVar202 + fVar128 * fVar225 + fVar129 * fVar52;
  fVar198 = fVar117 * fVar211 + fVar128 * fVar231 + fVar129 * fVar92;
  fVar200 = fVar117 * fVar212 + fVar128 * fVar234 + fVar129 * fVar94;
  fVar117 = fVar117 * (float)(auVar181._12_4_ >> 0x18) +
            fVar128 * (float)(auVar184._12_4_ >> 0x18) + fVar129 * (float)(auVar242._12_4_ >> 0x18);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar136 = fVar95 * fVar130 + fVar136 * fVar134 + fVar170 * fVar135;
  fVar149 = fVar115 * fVar130 + fVar149 * fVar134 + fVar174 * fVar135;
  fVar150 = fVar116 * fVar130 + fVar150 * fVar134 + fVar175 * fVar135;
  fVar170 = (float)(auVar157._12_4_ >> 0x18) * fVar130 +
            (float)(auVar215._12_4_ >> 0x18) * fVar134 + (float)(auVar55._12_4_ >> 0x18) * fVar135;
  fVar174 = fVar51 * fVar130 + fVar151 * fVar134 + fVar213 * fVar135;
  fVar175 = fVar91 * fVar130 + fVar168 * fVar134 + fVar221 * fVar135;
  fVar213 = fVar93 * fVar130 + fVar169 * fVar134 + fVar222 * fVar135;
  fVar221 = (float)(auVar58._12_4_ >> 0x18) * fVar130 +
            (float)(auVar153._12_4_ >> 0x18) * fVar134 + (float)(auVar178._12_4_ >> 0x18) * fVar135;
  fVar151 = fVar130 * fVar202 + fVar134 * fVar225 + fVar135 * fVar52;
  fVar168 = fVar130 * fVar211 + fVar134 * fVar231 + fVar135 * fVar92;
  fVar169 = fVar130 * fVar212 + fVar134 * fVar234 + fVar135 * fVar94;
  fVar130 = fVar130 * (float)(auVar181._12_4_ >> 0x18) +
            fVar134 * (float)(auVar184._12_4_ >> 0x18) + fVar135 * (float)(auVar242._12_4_ >> 0x18);
  fVar129 = (float)DAT_01f80d30;
  fVar51 = DAT_01f80d30._4_4_;
  fVar52 = DAT_01f80d30._8_4_;
  fVar91 = DAT_01f80d30._12_4_;
  uVar44 = -(uint)(fVar129 <= ABS(fVar255));
  uVar46 = -(uint)(fVar51 <= ABS(fVar260));
  uVar48 = -(uint)(fVar52 <= ABS(fVar261));
  uVar49 = -(uint)(fVar91 <= ABS(fVar262));
  auVar256._0_4_ = (uint)fVar255 & uVar44;
  auVar256._4_4_ = (uint)fVar260 & uVar46;
  auVar256._8_4_ = (uint)fVar261 & uVar48;
  auVar256._12_4_ = (uint)fVar262 & uVar49;
  auVar137._0_4_ = ~uVar44 & (uint)fVar129;
  auVar137._4_4_ = ~uVar46 & (uint)fVar51;
  auVar137._8_4_ = ~uVar48 & (uint)fVar52;
  auVar137._12_4_ = ~uVar49 & (uint)fVar91;
  auVar137 = auVar137 | auVar256;
  uVar44 = -(uint)(fVar129 <= ABS(fVar239));
  uVar46 = -(uint)(fVar51 <= ABS(fVar249));
  uVar48 = -(uint)(fVar52 <= ABS(fVar251));
  uVar49 = -(uint)(fVar91 <= ABS(fVar253));
  auVar244._0_4_ = (uint)fVar239 & uVar44;
  auVar244._4_4_ = (uint)fVar249 & uVar46;
  auVar244._8_4_ = (uint)fVar251 & uVar48;
  auVar244._12_4_ = (uint)fVar253 & uVar49;
  auVar155._0_4_ = ~uVar44 & (uint)fVar129;
  auVar155._4_4_ = ~uVar46 & (uint)fVar51;
  auVar155._8_4_ = ~uVar48 & (uint)fVar52;
  auVar155._12_4_ = ~uVar49 & (uint)fVar91;
  auVar155 = auVar155 | auVar244;
  uVar44 = -(uint)(fVar129 <= ABS(fVar176));
  uVar46 = -(uint)(fVar51 <= ABS(fVar198));
  uVar48 = -(uint)(fVar52 <= ABS(fVar200));
  uVar49 = -(uint)(fVar91 <= ABS(fVar117));
  auVar186._0_4_ = (uint)fVar176 & uVar44;
  auVar186._4_4_ = (uint)fVar198 & uVar46;
  auVar186._8_4_ = (uint)fVar200 & uVar48;
  auVar186._12_4_ = (uint)fVar117 & uVar49;
  auVar171._0_4_ = ~uVar44 & (uint)fVar129;
  auVar171._4_4_ = ~uVar46 & (uint)fVar51;
  auVar171._8_4_ = ~uVar48 & (uint)fVar52;
  auVar171._12_4_ = ~uVar49 & (uint)fVar91;
  auVar171 = auVar171 | auVar186;
  auVar60 = rcpps(_DAT_01f80d30,auVar137);
  fVar129 = auVar60._0_4_;
  fVar91 = auVar60._4_4_;
  fVar94 = auVar60._8_4_;
  fVar116 = auVar60._12_4_;
  fVar129 = (1.0 - auVar137._0_4_ * fVar129) * fVar129 + fVar129;
  fVar91 = (1.0 - auVar137._4_4_ * fVar91) * fVar91 + fVar91;
  fVar94 = (1.0 - auVar137._8_4_ * fVar94) * fVar94 + fVar94;
  fVar116 = (1.0 - auVar137._12_4_ * fVar116) * fVar116 + fVar116;
  auVar60 = rcpps(auVar60,auVar155);
  fVar51 = auVar60._0_4_;
  fVar92 = auVar60._4_4_;
  fVar95 = auVar60._8_4_;
  fVar117 = auVar60._12_4_;
  fVar51 = (1.0 - auVar155._0_4_ * fVar51) * fVar51 + fVar51;
  fVar92 = (1.0 - auVar155._4_4_ * fVar92) * fVar92 + fVar92;
  fVar95 = (1.0 - auVar155._8_4_ * fVar95) * fVar95 + fVar95;
  fVar117 = (1.0 - auVar155._12_4_ * fVar117) * fVar117 + fVar117;
  auVar60 = rcpps(auVar60,auVar171);
  fVar52 = auVar60._0_4_;
  fVar93 = auVar60._4_4_;
  fVar115 = auVar60._8_4_;
  fVar128 = auVar60._12_4_;
  fVar52 = (1.0 - auVar171._0_4_ * fVar52) * fVar52 + fVar52;
  fVar93 = (1.0 - auVar171._4_4_ * fVar93) * fVar93 + fVar93;
  fVar115 = (1.0 - auVar171._8_4_ * fVar115) * fVar115 + fVar115;
  fVar128 = (1.0 - auVar171._12_4_ * fVar128) * fVar128 + fVar128;
  uVar38 = *(ulong *)(prim + uVar37 * 7 + 6);
  uVar90 = (undefined2)(uVar38 >> 0x30);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar38;
  auVar63._12_2_ = uVar90;
  auVar63._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar38 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar38;
  auVar62._10_2_ = uVar90;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar90;
  auVar61._0_8_ = uVar38;
  uVar90 = (undefined2)(uVar38 >> 0x10);
  auVar29._4_8_ = auVar61._8_8_;
  auVar29._2_2_ = uVar90;
  auVar29._0_2_ = uVar90;
  auVar138._0_8_ =
       CONCAT44(((float)(auVar29._0_4_ >> 0x10) - fVar149) * fVar91,
                ((float)(int)(short)uVar38 - fVar136) * fVar129);
  auVar138._8_4_ = ((float)(auVar61._8_4_ >> 0x10) - fVar150) * fVar94;
  auVar138._12_4_ = ((float)(auVar62._12_4_ >> 0x10) - fVar170) * fVar116;
  uVar38 = *(ulong *)(prim + uVar37 * 9 + 6);
  uVar90 = (undefined2)(uVar38 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar38;
  auVar66._12_2_ = uVar90;
  auVar66._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar38 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar38;
  auVar65._10_2_ = uVar90;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar90;
  auVar64._0_8_ = uVar38;
  uVar90 = (undefined2)(uVar38 >> 0x10);
  auVar30._4_8_ = auVar64._8_8_;
  auVar30._2_2_ = uVar90;
  auVar30._0_2_ = uVar90;
  auVar172._0_4_ = ((float)(int)(short)uVar38 - fVar136) * fVar129;
  auVar172._4_4_ = ((float)(auVar30._0_4_ >> 0x10) - fVar149) * fVar91;
  auVar172._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar150) * fVar94;
  auVar172._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar170) * fVar116;
  uVar38 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar37 * -2 + 6);
  uVar90 = (undefined2)(uVar42 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar42;
  auVar98._12_2_ = uVar90;
  auVar98._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar42 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar42;
  auVar97._10_2_ = uVar90;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar90;
  auVar96._0_8_ = uVar42;
  uVar90 = (undefined2)(uVar42 >> 0x10);
  auVar31._4_8_ = auVar96._8_8_;
  auVar31._2_2_ = uVar90;
  auVar31._0_2_ = uVar90;
  auVar99._0_8_ =
       CONCAT44(((float)(auVar31._0_4_ >> 0x10) - fVar175) * fVar92,
                ((float)(int)(short)uVar42 - fVar174) * fVar51);
  auVar99._8_4_ = ((float)(auVar96._8_4_ >> 0x10) - fVar213) * fVar95;
  auVar99._12_4_ = ((float)(auVar97._12_4_ >> 0x10) - fVar221) * fVar117;
  uVar90 = (undefined2)(uVar38 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar38;
  auVar69._12_2_ = uVar90;
  auVar69._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar38 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar38;
  auVar68._10_2_ = uVar90;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar90;
  auVar67._0_8_ = uVar38;
  uVar90 = (undefined2)(uVar38 >> 0x10);
  auVar32._4_8_ = auVar67._8_8_;
  auVar32._2_2_ = uVar90;
  auVar32._0_2_ = uVar90;
  auVar203._0_4_ = ((float)(int)(short)uVar38 - fVar174) * fVar51;
  auVar203._4_4_ = ((float)(auVar32._0_4_ >> 0x10) - fVar175) * fVar92;
  auVar203._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar213) * fVar95;
  auVar203._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar221) * fVar117;
  uVar38 = *(ulong *)(prim + uVar41 + uVar37 + 6);
  uVar90 = (undefined2)(uVar38 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar38;
  auVar72._12_2_ = uVar90;
  auVar72._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar38 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar38;
  auVar71._10_2_ = uVar90;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar90;
  auVar70._0_8_ = uVar38;
  uVar90 = (undefined2)(uVar38 >> 0x10);
  auVar33._4_8_ = auVar70._8_8_;
  auVar33._2_2_ = uVar90;
  auVar33._0_2_ = uVar90;
  auVar73._0_8_ =
       CONCAT44(((float)(auVar33._0_4_ >> 0x10) - fVar168) * fVar93,
                ((float)(int)(short)uVar38 - fVar151) * fVar52);
  auVar73._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar169) * fVar115;
  auVar73._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar130) * fVar128;
  uVar38 = *(ulong *)(prim + uVar37 * 0x17 + 6);
  uVar90 = (undefined2)(uVar38 >> 0x30);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar38;
  auVar189._12_2_ = uVar90;
  auVar189._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar38 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar38;
  auVar188._10_2_ = uVar90;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar90;
  auVar187._0_8_ = uVar38;
  uVar90 = (undefined2)(uVar38 >> 0x10);
  auVar34._4_8_ = auVar187._8_8_;
  auVar34._2_2_ = uVar90;
  auVar34._0_2_ = uVar90;
  auVar190._0_4_ = ((float)(int)(short)uVar38 - fVar151) * fVar52;
  auVar190._4_4_ = ((float)(auVar34._0_4_ >> 0x10) - fVar168) * fVar93;
  auVar190._8_4_ = ((float)(auVar187._8_4_ >> 0x10) - fVar169) * fVar115;
  auVar190._12_4_ = ((float)(auVar188._12_4_ >> 0x10) - fVar130) * fVar128;
  auVar156._8_4_ = auVar138._8_4_;
  auVar156._0_8_ = auVar138._0_8_;
  auVar156._12_4_ = auVar138._12_4_;
  auVar157 = minps(auVar156,auVar172);
  auVar118._8_4_ = auVar99._8_4_;
  auVar118._0_8_ = auVar99._0_8_;
  auVar118._12_4_ = auVar99._12_4_;
  auVar60 = minps(auVar118,auVar203);
  auVar157 = maxps(auVar157,auVar60);
  auVar119._8_4_ = auVar73._8_4_;
  auVar119._0_8_ = auVar73._0_8_;
  auVar119._12_4_ = auVar73._12_4_;
  auVar60 = minps(auVar119,auVar190);
  auVar131._4_4_ = uVar5;
  auVar131._0_4_ = uVar5;
  auVar131._8_4_ = uVar5;
  auVar131._12_4_ = uVar5;
  auVar60 = maxps(auVar60,auVar131);
  auVar158 = maxps(auVar157,auVar60);
  auVar157 = maxps(auVar138,auVar172);
  auVar60 = maxps(auVar99,auVar203);
  auVar157 = minps(auVar157,auVar60);
  local_2c8 = auVar158._0_4_ * 0.99999964;
  fStack_2c4 = auVar158._4_4_ * 0.99999964;
  fStack_2c0 = auVar158._8_4_ * 0.99999964;
  fStack_2bc = auVar158._12_4_ * 0.99999964;
  auVar60 = maxps(auVar73,auVar190);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar5;
  auVar100._0_4_ = uVar5;
  auVar100._8_4_ = uVar5;
  auVar100._12_4_ = uVar5;
  auVar60 = minps(auVar60,auVar100);
  auVar60 = minps(auVar157,auVar60);
  auVar101._0_4_ = -(uint)(PVar4 != (Primitive)0x0 && local_2c8 <= auVar60._0_4_ * 1.0000004);
  auVar101._4_4_ = -(uint)(1 < (byte)PVar4 && fStack_2c4 <= auVar60._4_4_ * 1.0000004);
  auVar101._8_4_ = -(uint)(2 < (byte)PVar4 && fStack_2c0 <= auVar60._8_4_ * 1.0000004);
  auVar101._12_4_ = -(uint)(3 < (byte)PVar4 && fStack_2bc <= auVar60._12_4_ * 1.0000004);
  uVar44 = movmskps((uint)(byte)PVar4,auVar101);
  if (uVar44 == 0) {
    return;
  }
  uVar44 = uVar44 & 0xff;
  local_3c8 = pre->ray_space + k;
  local_3d0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_268._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_268._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_268._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_268._12_4_ = 0;
LAB_00a915cd:
  pLVar35 = local_3c8;
  local_3c0 = (ulong)uVar44;
  lVar9 = 0;
  if (local_3c0 != 0) {
    for (; (uVar44 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  uVar44 = *(uint *)(prim + 2);
  uVar46 = *(uint *)(prim + lVar9 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar44].ptr;
  uVar42 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar46);
  p_Var39 = pGVar6[1].intersectionFilterN;
  pvVar7 = pGVar6[2].userPtr;
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  puVar1 = (undefined8 *)(_Var8 + uVar42 * (long)pvVar7);
  uVar17 = *puVar1;
  uVar18 = puVar1[1];
  pfVar2 = (float *)(_Var8 + (uVar42 + 1) * (long)pvVar7);
  fVar129 = *pfVar2;
  fVar51 = pfVar2[1];
  fVar52 = pfVar2[2];
  fVar91 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (uVar42 + 2) * (long)pvVar7);
  fVar92 = *pfVar2;
  fVar93 = pfVar2[1];
  fVar94 = pfVar2[2];
  fVar95 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (long)pvVar7 * (uVar42 + 3));
  fVar115 = *pfVar2;
  fVar116 = pfVar2[1];
  fVar117 = pfVar2[2];
  fVar128 = pfVar2[3];
  local_3c0 = local_3c0 - 1 & local_3c0;
  uVar38 = *(ulong *)&pGVar6[1].time_range.upper;
  pfVar2 = (float *)(uVar38 + (long)p_Var39 * uVar42);
  fVar136 = *pfVar2;
  fVar149 = pfVar2[1];
  fVar150 = pfVar2[2];
  fVar170 = pfVar2[3];
  pfVar2 = (float *)(uVar38 + (long)p_Var39 * (uVar42 + 1));
  fVar151 = *pfVar2;
  fVar168 = pfVar2[1];
  fVar169 = pfVar2[2];
  fVar130 = pfVar2[3];
  pfVar2 = (float *)(uVar38 + (long)p_Var39 * (uVar42 + 2));
  fVar134 = *pfVar2;
  fVar135 = pfVar2[1];
  fVar174 = pfVar2[2];
  fVar175 = pfVar2[3];
  lVar9 = 0;
  if (local_3c0 != 0) {
    for (; (local_3c0 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  pfVar2 = (float *)(uVar38 + (long)p_Var39 * (uVar42 + 3));
  fVar176 = *pfVar2;
  fVar198 = pfVar2[1];
  fVar200 = pfVar2[2];
  fVar202 = pfVar2[3];
  if (((local_3c0 != 0) && (uVar42 = local_3c0 - 1 & local_3c0, uVar42 != 0)) &&
     (lVar9 = 0, uVar42 != 0)) {
    for (; (uVar42 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  local_1b8 = *(float *)(ray + k * 4);
  fStack_1b4 = *(float *)(ray + k * 4 + 0x10);
  fVar211 = *(float *)(ray + k * 4 + 0x20);
  fVar212 = (fVar134 * 0.5 + fVar176 * 0.0 + fVar151 * 0.0) - fVar136 * 0.5;
  fVar213 = (fVar135 * 0.5 + fVar198 * 0.0 + fVar168 * 0.0) - fVar149 * 0.5;
  fVar221 = (fVar174 * 0.5 + fVar200 * 0.0 + fVar169 * 0.0) - fVar150 * 0.5;
  fVar222 = (fVar175 * 0.5 + fVar202 * 0.0 + fVar130 * 0.0) - fVar170 * 0.5;
  local_408 = (float)uVar17;
  fStack_404 = (float)((ulong)uVar17 >> 0x20);
  fStack_400 = (float)uVar18;
  fStack_3fc = (float)((ulong)uVar18 >> 0x20);
  fVar249 = (fVar92 * 0.5 + fVar115 * 0.0 + fVar129 * 0.0) - local_408 * 0.5;
  fVar251 = (fVar93 * 0.5 + fVar116 * 0.0 + fVar51 * 0.0) - fStack_404 * 0.5;
  fVar262 = (fVar94 * 0.5 + fVar117 * 0.0 + fVar52 * 0.0) - fStack_400 * 0.5;
  fVar263 = (fVar95 * 0.5 + fVar128 * 0.0 + fVar91 * 0.0) - fStack_3fc * 0.5;
  fVar225 = fVar134 * 0.0 + fVar176 * -0.0 + fVar151 + fVar136 * -0.0;
  fVar231 = fVar135 * 0.0 + fVar198 * -0.0 + fVar168 + fVar149 * -0.0;
  fVar234 = fVar174 * 0.0 + fVar200 * -0.0 + fVar169 + fVar150 * -0.0;
  fVar239 = fVar175 * 0.0 + fVar202 * -0.0 + fVar130 + fVar170 * -0.0;
  fVar253 = fVar176 * -0.0 + fVar134 + fVar151 * 0.0 + fVar136 * -0.0;
  fVar255 = fVar198 * -0.0 + fVar135 + fVar168 * 0.0 + fVar149 * -0.0;
  fVar260 = fVar200 * -0.0 + fVar174 + fVar169 * 0.0 + fVar150 * -0.0;
  fVar261 = fVar202 * -0.0 + fVar175 + fVar130 * 0.0 + fVar170 * -0.0;
  fVar269 = fVar92 * 0.0 + fVar115 * -0.0 + fVar129 + local_408 * -0.0;
  fVar274 = fVar93 * 0.0 + fVar116 * -0.0 + fVar51 + fStack_404 * -0.0;
  fVar276 = fVar94 * 0.0 + fVar117 * -0.0 + fVar52 + fStack_400 * -0.0;
  fVar278 = fVar95 * 0.0 + fVar128 * -0.0 + fVar91 + fStack_3fc * -0.0;
  fVar134 = fVar136 * 0.0 + ((fVar176 * 0.5 + fVar134 * 0.0) - fVar151 * 0.5);
  fVar135 = fVar149 * 0.0 + ((fVar198 * 0.5 + fVar135 * 0.0) - fVar168 * 0.5);
  fVar174 = fVar150 * 0.0 + ((fVar200 * 0.5 + fVar174 * 0.0) - fVar169 * 0.5);
  fVar176 = fVar170 * 0.0 + ((fVar202 * 0.5 + fVar175 * 0.0) - fVar130 * 0.5);
  fVar136 = fVar115 * -0.0 + fVar92 + fVar129 * 0.0 + local_408 * -0.0;
  fVar149 = fVar116 * -0.0 + fVar93 + fVar51 * 0.0 + fStack_404 * -0.0;
  fVar150 = fVar117 * -0.0 + fVar94 + fVar52 * 0.0 + fStack_400 * -0.0;
  fVar170 = fVar128 * -0.0 + fVar95 + fVar91 * 0.0 + fStack_3fc * -0.0;
  fVar129 = local_408 * 0.0 + ((fVar115 * 0.5 + fVar92 * 0.0) - fVar129 * 0.5);
  fVar51 = fStack_404 * 0.0 + ((fVar116 * 0.5 + fVar93 * 0.0) - fVar51 * 0.5);
  fVar52 = fStack_400 * 0.0 + ((fVar117 * 0.5 + fVar94 * 0.0) - fVar52 * 0.5);
  fVar91 = fStack_3fc * 0.0 + ((fVar128 * 0.5 + fVar95 * 0.0) - fVar91 * 0.5);
  fVar264 = fVar213 * fVar269 - fVar274 * fVar212;
  fVar200 = fVar221 * fVar274 - fVar276 * fVar213;
  fVar202 = fVar212 * fVar276 - fVar269 * fVar221;
  fVar269 = fVar222 * fVar278 - fVar278 * fVar222;
  fVar151 = fVar213 * fVar249 - fVar251 * fVar212;
  fVar168 = fVar221 * fVar251 - fVar262 * fVar213;
  fVar175 = fVar212 * fVar262 - fVar249 * fVar221;
  fVar128 = fVar135 * fVar136 - fVar149 * fVar134;
  fVar149 = fVar174 * fVar149 - fVar150 * fVar135;
  fVar169 = fVar134 * fVar150 - fVar136 * fVar174;
  fVar130 = fVar176 * fVar170 - fVar170 * fVar176;
  fVar92 = fVar135 * fVar129 - fVar51 * fVar134;
  fVar51 = fVar174 * fVar51 - fVar52 * fVar135;
  fVar52 = fVar134 * fVar52 - fVar129 * fVar174;
  fVar170 = fVar202 * fVar202 + fVar200 * fVar200 + fVar264 * fVar264;
  auVar157 = ZEXT416((uint)fVar170);
  auVar60 = rsqrtss(ZEXT416((uint)fVar170),auVar157);
  fVar129 = auVar60._0_4_;
  fVar251 = fVar129 * 1.5 - fVar129 * fVar129 * fVar170 * 0.5 * fVar129;
  fVar274 = fVar264 * fVar151 + fVar202 * fVar175 + fVar200 * fVar168;
  fVar129 = fVar269 * fVar251;
  auVar60 = rcpss(auVar157,auVar157);
  fVar150 = (2.0 - fVar170 * auVar60._0_4_) * auVar60._0_4_;
  fVar198 = fVar169 * fVar169 + fVar149 * fVar149 + fVar128 * fVar128;
  auVar60 = ZEXT416((uint)fVar198);
  auVar157 = rsqrtss(ZEXT416((uint)fVar198),auVar60);
  fVar93 = auVar157._0_4_;
  fVar136 = fVar93 * 1.5 - fVar93 * fVar93 * fVar198 * 0.5 * fVar93;
  fVar262 = fVar128 * fVar92 + fVar169 * fVar52 + fVar149 * fVar51;
  fVar117 = fVar130 * fVar136;
  auVar60 = rcpss(auVar60,auVar60);
  fVar93 = (2.0 - fVar198 * auVar60._0_4_) * auVar60._0_4_;
  fVar94 = fVar239 * fVar200 * fVar251;
  fVar95 = fVar239 * fVar202 * fVar251;
  fVar115 = fVar239 * fVar264 * fVar251;
  fVar116 = fVar239 * fVar129;
  local_358 = fVar225 - fVar94;
  fStack_354 = fVar231 - fVar95;
  fStack_350 = fVar234 - fVar115;
  fStack_34c = fVar239 - fVar116;
  fVar200 = fVar239 * fVar150 * (fVar170 * fVar168 - fVar274 * fVar200) * fVar251 +
            fVar222 * fVar200 * fVar251;
  fVar202 = fVar239 * fVar150 * (fVar170 * fVar175 - fVar274 * fVar202) * fVar251 +
            fVar222 * fVar202 * fVar251;
  fVar249 = fVar239 * fVar150 * (fVar170 * fVar151 - fVar274 * fVar264) * fVar251 +
            fVar222 * fVar264 * fVar251;
  fVar251 = fVar239 * fVar150 * (fVar170 * (fVar222 * fVar263 - fVar263 * fVar222) -
                                fVar274 * fVar269) * fVar251 + fVar222 * fVar129;
  fVar94 = fVar94 + fVar225;
  fVar95 = fVar95 + fVar231;
  fVar115 = fVar115 + fVar234;
  fVar116 = fVar116 + fVar239;
  fVar150 = fVar261 * fVar149 * fVar136;
  fVar170 = fVar261 * fVar169 * fVar136;
  fVar151 = fVar261 * fVar128 * fVar136;
  fVar168 = fVar261 * fVar117;
  local_378 = fVar253 - fVar150;
  fStack_374 = fVar255 - fVar170;
  fStack_370 = fVar260 - fVar151;
  fStack_36c = fVar261 - fVar168;
  fVar129 = fVar261 * fVar93 * (fVar198 * fVar51 - fVar262 * fVar149) * fVar136 +
            fVar176 * fVar149 * fVar136;
  fVar51 = fVar261 * fVar93 * (fVar198 * fVar52 - fVar262 * fVar169) * fVar136 +
           fVar176 * fVar169 * fVar136;
  fVar52 = fVar261 * fVar93 * (fVar198 * fVar92 - fVar262 * fVar128) * fVar136 +
           fVar176 * fVar128 * fVar136;
  fVar91 = fVar261 * fVar93 * (fVar198 * (fVar176 * fVar91 - fVar91 * fVar176) - fVar262 * fVar130)
                     * fVar136 + fVar176 * fVar117;
  fVar150 = fVar150 + fVar253;
  fVar170 = fVar170 + fVar255;
  fVar151 = fVar151 + fVar260;
  fVar168 = fVar168 + fVar261;
  local_368 = (fVar212 - fVar200) * 0.33333334 + local_358;
  fStack_364 = (fVar213 - fVar202) * 0.33333334 + fStack_354;
  fStack_360 = (fVar221 - fVar249) * 0.33333334 + fStack_350;
  fStack_35c = (fVar222 - fVar251) * 0.33333334 + fStack_34c;
  local_388 = local_378 - (fVar134 - fVar129) * 0.33333334;
  fStack_384 = fStack_374 - (fVar135 - fVar51) * 0.33333334;
  fStack_380 = fStack_370 - (fVar174 - fVar52) * 0.33333334;
  fStack_37c = fStack_36c - (fVar176 - fVar91) * 0.33333334;
  fVar117 = fVar150 - (fVar129 + fVar134) * 0.33333334;
  fVar128 = fVar170 - (fVar51 + fVar135) * 0.33333334;
  fVar136 = fVar151 - (fVar52 + fVar174) * 0.33333334;
  fVar149 = fVar168 - (fVar91 + fVar176) * 0.33333334;
  local_148 = local_358 - local_1b8;
  fStack_144 = fStack_354 - fStack_1b4;
  fStack_140 = fStack_350 - fVar211;
  fStack_13c = fStack_34c - 0.0;
  fVar129 = (local_3c8->vx).field_0.m128[0];
  fVar51 = (local_3c8->vx).field_0.m128[1];
  fVar52 = (local_3c8->vy).field_0.m128[0];
  fVar91 = (local_3c8->vy).field_0.m128[1];
  fVar92 = (local_3c8->vz).field_0.m128[0];
  fVar93 = (local_3c8->vz).field_0.m128[1];
  fVar260 = local_148 * fVar129 + fStack_144 * fVar52 + fStack_140 * fVar92;
  fVar261 = local_148 * fVar51 + fStack_144 * fVar91 + fStack_140 * fVar93;
  local_308._0_8_ = CONCAT44(fVar261,fVar260);
  local_158 = local_368 - local_1b8;
  fStack_154 = fStack_364 - fStack_1b4;
  fStack_150 = fStack_360 - fVar211;
  fStack_14c = fStack_35c - 0.0;
  fVar176 = local_158 * fVar129 + fStack_154 * fVar52 + fStack_150 * fVar92;
  fVar198 = local_158 * fVar51 + fStack_154 * fVar91 + fStack_150 * fVar93;
  auVar281._4_4_ = fVar198;
  auVar281._0_4_ = fVar176;
  local_168 = local_388 - local_1b8;
  fStack_164 = fStack_384 - fStack_1b4;
  fStack_160 = fStack_380 - fVar211;
  fStack_15c = fStack_37c - 0.0;
  fVar253 = local_168 * fVar129 + fStack_164 * fVar52 + fStack_160 * fVar92;
  fVar255 = local_168 * fVar51 + fStack_164 * fVar91 + fStack_160 * fVar93;
  auVar102._4_4_ = fVar255;
  auVar102._0_4_ = fVar253;
  local_178 = local_378 - local_1b8;
  fStack_174 = fStack_374 - fStack_1b4;
  fStack_170 = fStack_370 - fVar211;
  fStack_16c = fStack_36c - 0.0;
  fVar174 = local_178 * fVar129 + fStack_174 * fVar52 + fStack_170 * fVar92;
  fVar175 = local_178 * fVar51 + fStack_174 * fVar91 + fStack_170 * fVar93;
  auVar266._4_4_ = fVar175;
  auVar266._0_4_ = fVar174;
  local_188 = fVar94 - local_1b8;
  fStack_184 = fVar95 - fStack_1b4;
  fStack_180 = fVar115 - fVar211;
  fStack_17c = fVar116 - 0.0;
  fVar225 = local_188 * fVar129 + fStack_184 * fVar52 + fStack_180 * fVar92;
  fVar231 = local_188 * fVar51 + fStack_184 * fVar91 + fStack_180 * fVar93;
  local_278 = (fVar200 + fVar212) * 0.33333334 + fVar94;
  fStack_274 = (fVar202 + fVar213) * 0.33333334 + fVar95;
  fStack_270 = (fVar249 + fVar221) * 0.33333334 + fVar115;
  fStack_26c = (fVar251 + fVar222) * 0.33333334 + fVar116;
  local_198 = local_278 - local_1b8;
  fStack_194 = fStack_274 - fStack_1b4;
  fStack_190 = fStack_270 - fVar211;
  fStack_18c = fStack_26c - 0.0;
  fVar134 = local_198 * fVar129 + fStack_194 * fVar52 + fStack_190 * fVar92;
  fVar135 = local_198 * fVar51 + fStack_194 * fVar91 + fStack_190 * fVar93;
  auVar281._12_4_ = fVar135;
  auVar281._8_4_ = fVar134;
  local_1a8 = fVar117 - local_1b8;
  fStack_1a4 = fVar128 - fStack_1b4;
  fStack_1a0 = fVar136 - fVar211;
  fStack_19c = fVar149 - 0.0;
  fVar169 = local_1a8 * fVar129 + fStack_1a4 * fVar52 + fStack_1a0 * fVar92;
  fVar130 = local_1a8 * fVar51 + fStack_1a4 * fVar91 + fStack_1a0 * fVar93;
  local_1b8 = fVar150 - local_1b8;
  fStack_1b4 = fVar170 - fStack_1b4;
  fStack_1b0 = fVar151 - fVar211;
  fStack_1ac = fVar168 - 0.0;
  fVar52 = local_1b8 * fVar129 + fStack_1b4 * fVar52 + fStack_1b0 * fVar92;
  fVar51 = local_1b8 * fVar51 + fStack_1b4 * fVar91 + fStack_1b0 * fVar93;
  auVar266._12_4_ = fVar51;
  auVar266._8_4_ = fVar52;
  auVar74._8_4_ = fVar225;
  auVar74._0_8_ = local_308._0_8_;
  auVar74._12_4_ = fVar231;
  auVar60 = minps(auVar74,auVar281);
  auVar102._8_4_ = fVar169;
  auVar102._12_4_ = fVar130;
  auVar157 = minps(auVar102,auVar266);
  auVar60 = minps(auVar60,auVar157);
  auVar103._4_4_ = fVar261;
  auVar103._0_4_ = fVar260;
  auVar103._8_4_ = fVar225;
  auVar103._12_4_ = fVar231;
  auVar157 = maxps(auVar103,auVar281);
  auVar120._4_4_ = fVar255;
  auVar120._0_4_ = fVar253;
  auVar120._8_4_ = fVar169;
  auVar120._12_4_ = fVar130;
  auVar121 = maxps(auVar120,auVar266);
  auVar158 = maxps(auVar157,auVar121);
  auVar10._4_8_ = auVar121._8_8_;
  auVar10._0_4_ = auVar60._4_4_;
  auVar122._0_8_ = auVar10._0_8_ << 0x20;
  auVar122._8_4_ = auVar60._8_4_;
  auVar122._12_4_ = auVar60._12_4_;
  auVar123._8_8_ = auVar60._8_8_;
  auVar123._0_8_ = auVar122._8_8_;
  auVar157 = minps(auVar60,auVar123);
  auVar11._4_8_ = auVar60._8_8_;
  auVar11._0_4_ = auVar158._4_4_;
  auVar124._0_8_ = auVar11._0_8_ << 0x20;
  auVar124._8_4_ = auVar158._8_4_;
  auVar124._12_4_ = auVar158._12_4_;
  auVar125._8_8_ = auVar158._8_8_;
  auVar125._0_8_ = auVar124._8_8_;
  auVar60 = maxps(auVar158,auVar125);
  auVar75._0_8_ = auVar157._0_8_ & 0x7fffffff7fffffff;
  auVar75._8_4_ = auVar157._8_4_ & 0x7fffffff;
  auVar75._12_4_ = auVar157._12_4_ & 0x7fffffff;
  auVar104._0_8_ = auVar60._0_8_ & 0x7fffffff7fffffff;
  auVar104._8_4_ = auVar60._8_4_ & 0x7fffffff;
  auVar104._12_4_ = auVar60._12_4_ & 0x7fffffff;
  auVar60 = maxps(auVar75,auVar104);
  fVar129 = auVar60._4_4_;
  if (auVar60._4_4_ <= auVar60._0_4_) {
    fVar129 = auVar60._0_4_;
  }
  fVar129 = fVar129 * 9.536743e-07;
  local_308._8_8_ = local_308._0_8_;
  local_248 = fVar129;
  fStack_244 = fVar129;
  fStack_240 = fVar129;
  fStack_23c = fVar129;
  local_258 = -fVar129;
  fStack_254 = -fVar129;
  fStack_250 = -fVar129;
  fStack_24c = -fVar129;
  local_118 = fVar176 - fVar260;
  fStack_114 = fVar198 - fVar261;
  fStack_110 = fVar134 - fVar225;
  fStack_10c = fVar135 - fVar231;
  local_128 = fVar253 - fVar176;
  fStack_124 = fVar255 - fVar198;
  fStack_120 = fVar169 - fVar134;
  fStack_11c = fVar130 - fVar135;
  local_138 = fVar174 - fVar253;
  fStack_134 = fVar175 - fVar255;
  fStack_130 = fVar52 - fVar169;
  fStack_12c = fVar51 - fVar130;
  local_288 = fVar94 - local_358;
  fStack_284 = fVar95 - fStack_354;
  fStack_280 = fVar115 - fStack_350;
  fStack_27c = fVar116 - fStack_34c;
  local_298 = local_278 - local_368;
  fStack_294 = fStack_274 - fStack_364;
  fStack_290 = fStack_270 - fStack_360;
  fStack_28c = fStack_26c - fStack_35c;
  local_2a8 = fVar117 - local_388;
  fStack_2a4 = fVar128 - fStack_384;
  fStack_2a0 = fVar136 - fStack_380;
  fStack_29c = fVar149 - fStack_37c;
  local_2b8 = fVar150 - local_378;
  fStack_2b4 = fVar170 - fStack_374;
  fStack_2b0 = fVar151 - fStack_370;
  fStack_2ac = fVar168 - fStack_36c;
  local_2d8 = uVar44;
  uStack_2d4 = uVar44;
  uStack_2d0 = uVar44;
  uStack_2cc = uVar44;
  local_2e8 = uVar46;
  uStack_2e4 = uVar46;
  uStack_2e0 = uVar46;
  uStack_2dc = uVar46;
  uVar42 = 0;
  fVar91 = *(float *)(ray + k * 4 + 0x30);
  local_538._4_4_ = 0.0;
  fStack_52c = 1.0;
  local_538._0_4_ = 0.0;
  fVar92 = 1.0;
LAB_00a91f33:
  do {
    fVar93 = 1.0 - (float)local_538._4_4_;
    fVar116 = 1.0 - (float)local_538._4_4_;
    fVar149 = 1.0 - fStack_52c;
    fVar168 = 1.0 - fStack_52c;
    fVar264 = local_308._0_4_ * fVar93 + fVar225 * (float)local_538._4_4_;
    fVar232 = local_308._4_4_ * fVar116 + fVar231 * (float)local_538._4_4_;
    fVar235 = local_308._8_4_ * fVar149 + fVar225 * fStack_52c;
    fVar237 = local_308._12_4_ * fVar168 + fVar231 * fStack_52c;
    fVar200 = fVar176 * fVar93 + fVar134 * (float)local_538._4_4_;
    fVar263 = fVar198 * fVar116 + fVar135 * (float)local_538._4_4_;
    fVar223 = fVar176 * fVar149 + fVar134 * fStack_52c;
    fVar224 = fVar198 * fVar168 + fVar135 * fStack_52c;
    fVar280 = fVar253 * fVar93 + fVar169 * (float)local_538._4_4_;
    fVar283 = fVar255 * fVar116 + fVar130 * (float)local_538._4_4_;
    fVar284 = fVar253 * fVar149 + fVar169 * fStack_52c;
    fVar285 = fVar255 * fVar168 + fVar130 * fStack_52c;
    fVar240 = fVar93 * fVar174 + (float)local_538._4_4_ * fVar52;
    fVar250 = fVar116 * fVar175 + (float)local_538._4_4_ * fVar51;
    fVar252 = fVar149 * fVar174 + fStack_52c * fVar52;
    fVar254 = fVar168 * fVar175 + fStack_52c * fVar51;
    fVar265 = (fVar92 - (float)local_538._0_4_) * 0.11111111;
    fVar270 = (fVar92 - (float)local_538._0_4_) * 0.0 + (float)local_538._0_4_;
    fVar275 = (fVar92 - (float)local_538._0_4_) * 0.33333334 + (float)local_538._0_4_;
    fVar277 = (fVar92 - (float)local_538._0_4_) * 0.6666667 + (float)local_538._0_4_;
    fVar279 = (fVar92 - (float)local_538._0_4_) * 1.0 + (float)local_538._0_4_;
    fVar149 = 1.0 - fVar270;
    fVar202 = 1.0 - fVar275;
    fVar221 = 1.0 - fVar277;
    fVar249 = 1.0 - fVar279;
    fVar212 = fVar200 * fVar149 + fVar280 * fVar270;
    fVar213 = fVar200 * fVar202 + fVar280 * fVar275;
    fVar222 = fVar200 * fVar221 + fVar280 * fVar277;
    fVar251 = fVar200 * fVar249 + fVar280 * fVar279;
    fVar262 = fVar263 * fVar149 + fVar283 * fVar270;
    fVar269 = fVar263 * fVar202 + fVar283 * fVar275;
    fVar274 = fVar263 * fVar221 + fVar283 * fVar277;
    fVar276 = fVar263 * fVar249 + fVar283 * fVar279;
    fVar93 = (fVar264 * fVar149 + fVar200 * fVar270) * fVar149 + fVar270 * fVar212;
    fVar116 = (fVar264 * fVar202 + fVar200 * fVar275) * fVar202 + fVar275 * fVar213;
    fVar168 = (fVar264 * fVar221 + fVar200 * fVar277) * fVar221 + fVar277 * fVar222;
    fVar200 = (fVar264 * fVar249 + fVar200 * fVar279) * fVar249 + fVar279 * fVar251;
    fVar278 = (fVar232 * fVar149 + fVar263 * fVar270) * fVar149 + fVar270 * fVar262;
    fVar199 = (fVar232 * fVar202 + fVar263 * fVar275) * fVar202 + fVar275 * fVar269;
    fVar201 = (fVar232 * fVar221 + fVar263 * fVar277) * fVar221 + fVar277 * fVar274;
    fVar232 = (fVar232 * fVar249 + fVar263 * fVar279) * fVar249 + fVar279 * fVar276;
    fVar212 = fVar212 * fVar149 + (fVar280 * fVar149 + fVar240 * fVar270) * fVar270;
    fVar213 = fVar213 * fVar202 + (fVar280 * fVar202 + fVar240 * fVar275) * fVar275;
    fVar222 = fVar222 * fVar221 + (fVar280 * fVar221 + fVar240 * fVar277) * fVar277;
    fVar263 = fVar251 * fVar249 + (fVar280 * fVar249 + fVar240 * fVar279) * fVar279;
    fVar264 = fVar262 * fVar149 + (fVar283 * fVar149 + fVar250 * fVar270) * fVar270;
    fVar269 = fVar269 * fVar202 + (fVar283 * fVar202 + fVar250 * fVar275) * fVar275;
    fVar274 = fVar274 * fVar221 + (fVar283 * fVar221 + fVar250 * fVar277) * fVar277;
    fVar276 = fVar276 * fVar249 + (fVar283 * fVar249 + fVar250 * fVar279) * fVar279;
    local_348 = fVar149 * fVar93 + fVar270 * fVar212;
    fStack_344 = fVar202 * fVar116 + fVar275 * fVar213;
    fStack_340 = fVar221 * fVar168 + fVar277 * fVar222;
    fStack_33c = fVar249 * fVar200 + fVar279 * fVar263;
    local_238 = fVar149 * fVar278 + fVar270 * fVar264;
    fStack_234 = fVar202 * fVar199 + fVar275 * fVar269;
    fStack_230 = fVar221 * fVar201 + fVar277 * fVar274;
    fStack_22c = fVar249 * fVar232 + fVar279 * fVar276;
    fVar251 = (fVar213 - fVar116) * 3.0 * fVar265;
    fVar262 = (fVar222 - fVar168) * 3.0 * fVar265;
    fVar263 = (fVar263 - fVar200) * 3.0 * fVar265;
    fVar116 = (fVar269 - fVar199) * 3.0 * fVar265;
    fVar200 = (fVar274 - fVar201) * 3.0 * fVar265;
    fVar213 = (fVar276 - fVar232) * 3.0 * fVar265;
    local_318._4_4_ = fStack_340;
    local_318._0_4_ = fStack_344;
    local_318._8_4_ = fStack_33c;
    local_318._12_4_ = 0;
    local_1d8._4_4_ = fStack_230;
    local_1d8._0_4_ = fStack_234;
    local_328 = local_348 + (fVar212 - fVar93) * 3.0 * fVar265;
    fStack_324 = fStack_344 + fVar251;
    fStack_320 = fStack_340 + fVar262;
    fStack_31c = fStack_33c + fVar263;
    fVar93 = local_238 + (fVar264 - fVar278) * 3.0 * fVar265;
    fVar168 = fStack_234 + fVar116;
    fVar212 = fStack_230 + fVar200;
    fVar222 = fStack_22c + fVar213;
    local_338._0_4_ = fStack_344 - fVar251;
    local_338._4_4_ = fStack_340 - fVar262;
    local_338._8_4_ = fStack_33c - fVar263;
    local_338._12_4_ = 0;
    fVar116 = fStack_234 - fVar116;
    fVar200 = fStack_230 - fVar200;
    fVar213 = fStack_22c - fVar213;
    fVar251 = fVar223 * fVar149 + fVar284 * fVar270;
    fVar262 = fVar223 * fVar202 + fVar284 * fVar275;
    fVar263 = fVar223 * fVar221 + fVar284 * fVar277;
    fVar264 = fVar223 * fVar249 + fVar284 * fVar279;
    fVar269 = fVar224 * fVar149 + fVar285 * fVar270;
    fVar274 = fVar224 * fVar202 + fVar285 * fVar275;
    fVar276 = fVar224 * fVar221 + fVar285 * fVar277;
    fVar278 = fVar224 * fVar249 + fVar285 * fVar279;
    fVar199 = (fVar235 * fVar149 + fVar223 * fVar270) * fVar149 + fVar270 * fVar251;
    fVar201 = (fVar235 * fVar202 + fVar223 * fVar275) * fVar202 + fVar275 * fVar262;
    fVar232 = (fVar235 * fVar221 + fVar223 * fVar277) * fVar221 + fVar277 * fVar263;
    fVar223 = (fVar235 * fVar249 + fVar223 * fVar279) * fVar249 + fVar279 * fVar264;
    fVar283 = (fVar237 * fVar149 + fVar224 * fVar270) * fVar149 + fVar270 * fVar269;
    fVar233 = (fVar237 * fVar202 + fVar224 * fVar275) * fVar202 + fVar275 * fVar274;
    fVar236 = (fVar237 * fVar221 + fVar224 * fVar277) * fVar221 + fVar277 * fVar276;
    fVar238 = (fVar237 * fVar249 + fVar224 * fVar279) * fVar249 + fVar279 * fVar278;
    fVar224 = fVar251 * fVar149 + (fVar284 * fVar149 + fVar252 * fVar270) * fVar270;
    fVar235 = fVar262 * fVar202 + (fVar284 * fVar202 + fVar252 * fVar275) * fVar275;
    fVar237 = fVar263 * fVar221 + (fVar284 * fVar221 + fVar252 * fVar277) * fVar277;
    fVar240 = fVar264 * fVar249 + (fVar284 * fVar249 + fVar252 * fVar279) * fVar279;
    fVar250 = fVar269 * fVar149 + (fVar285 * fVar149 + fVar254 * fVar270) * fVar270;
    fVar252 = fVar274 * fVar202 + (fVar285 * fVar202 + fVar254 * fVar275) * fVar275;
    fVar280 = fVar276 * fVar221 + (fVar285 * fVar221 + fVar254 * fVar277) * fVar277;
    fVar254 = fVar278 * fVar249 + (fVar285 * fVar249 + fVar254 * fVar279) * fVar279;
    fVar269 = fVar149 * fVar199 + fVar270 * fVar224;
    fVar274 = fVar202 * fVar201 + fVar275 * fVar235;
    fVar276 = fVar221 * fVar232 + fVar277 * fVar237;
    fVar278 = fVar249 * fVar223 + fVar279 * fVar240;
    fVar251 = fVar149 * fVar283 + fVar270 * fVar250;
    fVar262 = fVar202 * fVar233 + fVar275 * fVar252;
    fVar263 = fVar221 * fVar236 + fVar277 * fVar280;
    fVar264 = fVar249 * fVar238 + fVar279 * fVar254;
    fVar149 = (fVar235 - fVar201) * 3.0 * fVar265;
    fVar202 = (fVar237 - fVar232) * 3.0 * fVar265;
    fVar221 = (fVar240 - fVar223) * 3.0 * fVar265;
    fVar249 = (fVar252 - fVar233) * 3.0 * fVar265;
    fVar201 = (fVar280 - fVar236) * 3.0 * fVar265;
    fVar232 = (fVar254 - fVar238) * 3.0 * fVar265;
    local_1e8._4_4_ = fVar276;
    local_1e8._0_4_ = fVar274;
    local_1e8._8_4_ = fVar278;
    local_1e8._12_4_ = 0;
    local_208._4_4_ = fVar263;
    local_208._0_4_ = fVar262;
    local_208._8_4_ = fVar264;
    local_208._12_4_ = 0;
    local_228 = fVar269 + (fVar224 - fVar199) * 3.0 * fVar265;
    fStack_224 = fVar274 + fVar149;
    fStack_220 = fVar276 + fVar202;
    fStack_21c = fVar278 + fVar221;
    local_1f8 = fVar251 + (fVar250 - fVar283) * 3.0 * fVar265;
    fStack_1f4 = fVar262 + fVar249;
    fStack_1f0 = fVar263 + fVar201;
    fStack_1ec = fVar264 + fVar232;
    local_1c8._0_4_ = fVar274 - fVar149;
    local_1c8._4_4_ = fVar276 - fVar202;
    local_1c8._8_4_ = fVar278 - fVar221;
    local_1c8._12_4_ = 0;
    local_218._0_4_ = fVar262 - fVar249;
    local_218._4_4_ = fVar263 - fVar201;
    local_218._8_4_ = fVar264 - fVar232;
    local_218._12_4_ = 0;
    fVar149 = (fVar274 - fStack_344) + (fVar269 - local_348);
    fVar202 = (fVar276 - fStack_340) + (fVar274 - fStack_344);
    fVar221 = (fVar278 - fStack_33c) + (fVar276 - fStack_340);
    fVar249 = (fVar278 - fStack_33c) + 0.0;
    local_1d8._8_4_ = fStack_22c;
    local_1d8._12_4_ = 0;
    fVar199 = (fVar262 - fStack_234) + (fVar251 - local_238);
    fVar201 = (fVar263 - fStack_230) + (fVar262 - fStack_234);
    fVar232 = (fVar264 - fStack_22c) + (fVar263 - fStack_230);
    fVar223 = (fVar264 - fStack_22c) + 0.0;
    auVar191._0_8_ =
         CONCAT44(fStack_234 * fVar202 - fStack_344 * fVar201,
                  local_238 * fVar149 - local_348 * fVar199);
    auVar191._8_4_ = fStack_230 * fVar221 - fStack_340 * fVar232;
    auVar191._12_4_ = fStack_22c * fVar249 - fStack_33c * fVar223;
    auVar139._0_4_ = fVar93 * fVar149 - local_328 * fVar199;
    auVar139._4_4_ = fVar168 * fVar202 - fStack_324 * fVar201;
    auVar139._8_4_ = fVar212 * fVar221 - fStack_320 * fVar232;
    auVar139._12_4_ = fVar222 * fVar249 - fStack_31c * fVar223;
    auVar159._0_8_ =
         CONCAT44(fVar200 * fVar202 - fVar201 * local_338._4_4_,
                  fVar116 * fVar149 - fVar199 * local_338._0_4_);
    auVar159._8_4_ = fVar213 * fVar221 - fVar232 * local_338._8_4_;
    auVar159._12_4_ = fVar249 * 0.0 - fVar223 * 0.0;
    auVar257._0_4_ = fVar149 * fStack_234 - fVar199 * fStack_344;
    auVar257._4_4_ = fVar202 * fStack_230 - fVar201 * fStack_340;
    auVar257._8_4_ = fVar221 * fStack_22c - fVar232 * fStack_33c;
    auVar257._12_4_ = fVar249 * 0.0 - fVar223 * 0.0;
    auVar214._0_8_ =
         CONCAT44(fVar262 * fVar202 - fVar274 * fVar201,fVar251 * fVar149 - fVar269 * fVar199);
    auVar214._8_4_ = fVar263 * fVar221 - fVar276 * fVar232;
    auVar214._12_4_ = fVar264 * fVar249 - fVar278 * fVar223;
    auVar267._0_4_ = local_1f8 * fVar149 - local_228 * fVar199;
    auVar267._4_4_ = fStack_1f4 * fVar202 - fStack_224 * fVar201;
    auVar267._8_4_ = fStack_1f0 * fVar221 - fStack_220 * fVar232;
    auVar267._12_4_ = fStack_1ec * fVar249 - fStack_21c * fVar223;
    auVar204._0_8_ =
         CONCAT44(local_218._4_4_ * fVar202 - fVar201 * local_1c8._4_4_,
                  local_218._0_4_ * fVar149 - fVar199 * local_1c8._0_4_);
    auVar204._8_4_ = local_218._8_4_ * fVar221 - fVar232 * local_1c8._8_4_;
    auVar204._12_4_ = fVar249 * 0.0 - fVar223 * 0.0;
    auVar76._0_4_ = fVar149 * fVar262 - fVar199 * fVar274;
    auVar76._4_4_ = fVar202 * fVar263 - fVar201 * fVar276;
    auVar76._8_4_ = fVar221 * fVar264 - fVar232 * fVar278;
    auVar76._12_4_ = fVar249 * 0.0 - fVar223 * 0.0;
    auVar105._8_4_ = auVar191._8_4_;
    auVar105._0_8_ = auVar191._0_8_;
    auVar105._12_4_ = auVar191._12_4_;
    auVar60 = minps(auVar105,auVar139);
    auVar158 = maxps(auVar191,auVar139);
    auVar140._8_4_ = auVar159._8_4_;
    auVar140._0_8_ = auVar159._0_8_;
    auVar140._12_4_ = auVar159._12_4_;
    auVar157 = minps(auVar140,auVar257);
    auVar60 = minps(auVar60,auVar157);
    auVar157 = maxps(auVar159,auVar257);
    auVar121 = maxps(auVar158,auVar157);
    auVar141._8_4_ = auVar214._8_4_;
    auVar141._0_8_ = auVar214._0_8_;
    auVar141._12_4_ = auVar214._12_4_;
    auVar157 = minps(auVar141,auVar267);
    auVar215 = maxps(auVar214,auVar267);
    auVar160._8_4_ = auVar204._8_4_;
    auVar160._0_8_ = auVar204._0_8_;
    auVar160._12_4_ = auVar204._12_4_;
    auVar158 = minps(auVar160,auVar76);
    auVar157 = minps(auVar157,auVar158);
    auVar60 = minps(auVar60,auVar157);
    auVar157 = maxps(auVar204,auVar76);
    auVar157 = maxps(auVar215,auVar157);
    auVar157 = maxps(auVar121,auVar157);
    auVar192._0_4_ =
         -(uint)(local_258 <= auVar157._0_4_ && auVar60._0_4_ <= local_248) & local_268._0_4_;
    auVar192._4_4_ =
         -(uint)(fStack_254 <= auVar157._4_4_ && auVar60._4_4_ <= fStack_244) & local_268._4_4_;
    auVar192._8_4_ =
         -(uint)(fStack_250 <= auVar157._8_4_ && auVar60._8_4_ <= fStack_240) & local_268._8_4_;
    auVar192._12_4_ =
         -(uint)(fStack_24c <= auVar157._12_4_ && auVar60._12_4_ <= fStack_23c) & local_268._12_4_;
    uVar48 = movmskps((int)uVar38,auVar192);
    uVar38 = (ulong)uVar48;
    if (uVar48 != 0) {
      fVar149 = (fVar274 - fVar269) + (fStack_344 - local_348);
      fVar202 = (fVar276 - fVar274) + (fStack_340 - fStack_344);
      fVar221 = (fVar278 - fVar276) + (fStack_33c - fStack_340);
      fVar249 = (0.0 - fVar278) + (0.0 - fStack_33c);
      fVar199 = (fVar262 - fVar251) + (fStack_234 - local_238);
      fVar201 = (fVar263 - fVar262) + (fStack_230 - fStack_234);
      fVar232 = (fVar264 - fVar263) + (fStack_22c - fStack_230);
      fVar223 = (0.0 - fVar264) + (0.0 - fStack_22c);
      auVar271._0_8_ =
           CONCAT44(fStack_234 * fVar202 - fStack_344 * fVar201,
                    local_238 * fVar149 - local_348 * fVar199);
      auVar271._8_4_ = fStack_230 * fVar221 - fStack_340 * fVar232;
      auVar271._12_4_ = fStack_22c * fVar249 - fStack_33c * fVar223;
      auVar142._0_4_ = fVar93 * fVar149 - local_328 * fVar199;
      auVar142._4_4_ = fVar168 * fVar202 - fStack_324 * fVar201;
      auVar142._8_4_ = fVar212 * fVar221 - fStack_320 * fVar232;
      auVar142._12_4_ = fVar222 * fVar249 - fStack_31c * fVar223;
      auVar205._0_8_ =
           CONCAT44(fVar200 * fVar202 - local_338._4_4_ * fVar201,
                    fVar116 * fVar149 - local_338._0_4_ * fVar199);
      auVar205._8_4_ = fVar213 * fVar221 - local_338._8_4_ * fVar232;
      auVar205._12_4_ = fVar249 * 0.0 - fVar223 * 0.0;
      auVar161._0_4_ = fStack_234 * fVar149 - fStack_344 * fVar199;
      auVar161._4_4_ = fStack_230 * fVar202 - fStack_340 * fVar201;
      auVar161._8_4_ = fStack_22c * fVar221 - fStack_33c * fVar232;
      auVar161._12_4_ = fVar249 * 0.0 - fVar223 * 0.0;
      auVar126._0_8_ =
           CONCAT44(fVar262 * fVar202 - fVar274 * fVar201,fVar251 * fVar149 - fVar269 * fVar199);
      auVar126._8_4_ = fVar263 * fVar221 - fVar276 * fVar232;
      auVar126._12_4_ = fVar264 * fVar249 - fVar278 * fVar223;
      auVar226._0_4_ = local_1f8 * fVar149 - local_228 * fVar199;
      auVar226._4_4_ = fStack_1f4 * fVar202 - fStack_224 * fVar201;
      auVar226._8_4_ = fStack_1f0 * fVar221 - fStack_220 * fVar232;
      auVar226._12_4_ = fStack_1ec * fVar249 - fStack_21c * fVar223;
      auVar258._0_8_ =
           CONCAT44(local_218._4_4_ * fVar202 - local_1c8._4_4_ * fVar201,
                    local_218._0_4_ * fVar149 - local_1c8._0_4_ * fVar199);
      auVar258._8_4_ = local_218._8_4_ * fVar221 - local_1c8._8_4_ * fVar232;
      auVar258._12_4_ = fVar249 * 0.0 - fVar223 * 0.0;
      auVar77._0_4_ = fVar149 * fVar262 - fVar199 * fVar274;
      auVar77._4_4_ = fVar202 * fVar263 - fVar201 * fVar276;
      auVar77._8_4_ = fVar221 * fVar264 - fVar232 * fVar278;
      auVar77._12_4_ = fVar249 * 0.0 - fVar223 * 0.0;
      auVar106._8_4_ = auVar271._8_4_;
      auVar106._0_8_ = auVar271._0_8_;
      auVar106._12_4_ = auVar271._12_4_;
      auVar60 = minps(auVar106,auVar142);
      auVar158 = maxps(auVar271,auVar142);
      auVar143._8_4_ = auVar205._8_4_;
      auVar143._0_8_ = auVar205._0_8_;
      auVar143._12_4_ = auVar205._12_4_;
      auVar157 = minps(auVar143,auVar161);
      auVar60 = minps(auVar60,auVar157);
      auVar157 = maxps(auVar205,auVar161);
      auVar215 = maxps(auVar158,auVar157);
      auVar144._8_4_ = auVar126._8_4_;
      auVar144._0_8_ = auVar126._0_8_;
      auVar144._12_4_ = auVar126._12_4_;
      auVar158 = minps(auVar144,auVar226);
      auVar157 = maxps(auVar126,auVar226);
      auVar162._8_4_ = auVar258._8_4_;
      auVar162._0_8_ = auVar258._0_8_;
      auVar162._12_4_ = auVar258._12_4_;
      auVar121 = minps(auVar162,auVar77);
      auVar158 = minps(auVar158,auVar121);
      auVar60 = minps(auVar60,auVar158);
      auVar158 = maxps(auVar258,auVar77);
      auVar157 = maxps(auVar157,auVar158);
      auVar157 = maxps(auVar215,auVar157);
      auVar272._0_4_ =
           -(uint)(local_258 <= auVar157._0_4_ && auVar60._0_4_ <= local_248) & auVar192._0_4_;
      auVar272._4_4_ =
           -(uint)(fStack_254 <= auVar157._4_4_ && auVar60._4_4_ <= fStack_244) & auVar192._4_4_;
      auVar272._8_4_ =
           -(uint)(fStack_250 <= auVar157._8_4_ && auVar60._8_4_ <= fStack_240) & auVar192._8_4_;
      auVar272._12_4_ =
           -(uint)(fStack_24c <= auVar157._12_4_ && auVar60._12_4_ <= fStack_23c) & auVar192._12_4_;
      uVar48 = movmskps(uVar48,auVar272);
      uVar38 = (ulong)uVar48;
      if (uVar48 != 0) {
        uVar38 = (ulong)(byte)uVar48;
        auStack_2f8[uVar42] = uVar48 & 0xff;
        *(ulong *)(afStack_108 + uVar42 * 2) = CONCAT44(fVar92,local_538._0_4_);
        *(ulong *)(afStack_58 + uVar42 * 2) = CONCAT44(fStack_52c,local_538._4_4_);
        uVar42 = (ulong)((int)uVar42 + 1);
      }
    }
LAB_00a925a0:
    if ((int)uVar42 == 0) {
      fVar129 = *(float *)(ray + k * 4 + 0x80);
      auVar114._4_4_ = -(uint)(fStack_2c4 <= fVar129);
      auVar114._0_4_ = -(uint)(local_2c8 <= fVar129);
      auVar114._8_4_ = -(uint)(fStack_2c0 <= fVar129);
      auVar114._12_4_ = -(uint)(fStack_2bc <= fVar129);
      uVar44 = movmskps((int)uVar38,auVar114);
      uVar44 = (uint)local_3c0 & uVar44;
      if (uVar44 == 0) {
        return;
      }
      goto LAB_00a915cd;
    }
    uVar49 = (int)uVar42 - 1;
    uVar38 = (ulong)uVar49;
    uVar48 = auStack_2f8[uVar38];
    local_538._4_4_ = afStack_58[uVar38 * 2];
    fStack_52c = afStack_58[uVar38 * 2 + 1];
    uVar37 = 0;
    if (uVar48 != 0) {
      for (; (uVar48 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
      }
    }
    uVar48 = uVar48 - 1 & uVar48;
    auStack_2f8[uVar38] = uVar48;
    if (uVar48 == 0) {
      uVar42 = (ulong)uVar49;
    }
    fVar92 = (float)(uVar37 + 1) * 0.33333334;
    fVar93 = afStack_108[uVar38 * 2];
    fVar116 = afStack_108[uVar38 * 2 + 1];
    local_538._0_4_ =
         fVar93 * (1.0 - (float)uVar37 * 0.33333334) + fVar116 * (float)uVar37 * 0.33333334;
    fVar92 = fVar93 * (1.0 - fVar92) + fVar116 * fVar92;
    fVar149 = fVar93 * 0.0 + fVar116 * 0.0;
    fVar116 = fVar93 * 0.0 + fVar116 * 0.0;
    fVar93 = fVar92 - (float)local_538._0_4_;
    if (fVar93 < 0.16666667) {
      fVar251 = 1.0 - (float)local_538._4_4_;
      fVar264 = 1.0 - (float)local_538._4_4_;
      fVar269 = 1.0 - fStack_52c;
      fVar274 = 1.0 - fStack_52c;
      fVar213 = local_308._0_4_ * fVar251 + fVar225 * (float)local_538._4_4_;
      fVar249 = local_308._4_4_ * fVar264 + fVar231 * (float)local_538._4_4_;
      fVar262 = local_308._8_4_ * fVar269 + fVar225 * fStack_52c;
      fVar263 = local_308._12_4_ * fVar274 + fVar231 * fStack_52c;
      fVar168 = fVar176 * fVar251 + fVar134 * (float)local_538._4_4_;
      fVar200 = fVar198 * fVar264 + fVar135 * (float)local_538._4_4_;
      fVar202 = fVar176 * fVar269 + fVar134 * fStack_52c;
      fVar221 = fVar198 * fVar274 + fVar135 * fStack_52c;
      fVar224 = fVar253 * fVar251 + fVar169 * (float)local_538._4_4_;
      fVar237 = fVar255 * fVar264 + fVar130 * (float)local_538._4_4_;
      fVar250 = fVar253 * fVar269 + fVar169 * fStack_52c;
      fVar280 = fVar255 * fVar274 + fVar130 * fStack_52c;
      fVar278 = (fVar251 * fVar174 + (float)local_538._4_4_ * fVar52) - fVar224;
      fVar199 = (fVar264 * fVar175 + (float)local_538._4_4_ * fVar51) - fVar237;
      fVar201 = (fVar269 * fVar174 + fStack_52c * fVar52) - fVar250;
      fVar223 = (fVar274 * fVar175 + fStack_52c * fVar51) - fVar280;
      fVar251 = (float)local_538._0_4_ * (fVar224 - fVar168) + fVar168;
      fVar264 = (float)local_538._0_4_ * (fVar237 - fVar200) + fVar200;
      fVar269 = (float)local_538._0_4_ * (fVar250 - fVar202) + fVar202;
      fVar232 = (float)local_538._0_4_ * (fVar280 - fVar221) + fVar221;
      fVar235 = (fVar224 - fVar168) * fVar92 + fVar168;
      fVar240 = (fVar237 - fVar200) * fVar92 + fVar200;
      fVar252 = (fVar250 - fVar202) * fVar92 + fVar202;
      fVar254 = (fVar280 - fVar221) * fVar92 + fVar221;
      fVar274 = (float)local_538._0_4_ * (fVar168 - fVar213) + fVar213;
      fVar276 = (float)local_538._0_4_ * (fVar200 - fVar249) + fVar249;
      fVar283 = (float)local_538._0_4_ * (fVar202 - fVar262) + fVar262;
      fVar233 = (float)local_538._0_4_ * (fVar221 - fVar263) + fVar263;
      fVar274 = (fVar251 - fVar274) * (float)local_538._0_4_ + fVar274;
      fVar276 = (fVar264 - fVar276) * (float)local_538._0_4_ + fVar276;
      fVar283 = (fVar269 - fVar283) * (float)local_538._0_4_ + fVar283;
      fVar233 = (fVar232 - fVar233) * (float)local_538._0_4_ + fVar233;
      fVar251 = ((((float)local_538._0_4_ * fVar278 + fVar224) - fVar251) * (float)local_538._0_4_ +
                fVar251) - fVar274;
      fVar264 = ((((float)local_538._0_4_ * fVar199 + fVar237) - fVar264) * (float)local_538._0_4_ +
                fVar264) - fVar276;
      fVar269 = ((((float)local_538._0_4_ * fVar201 + fVar250) - fVar269) * (float)local_538._0_4_ +
                fVar269) - fVar283;
      fVar232 = ((((float)local_538._0_4_ * fVar223 + fVar280) - fVar232) * (float)local_538._0_4_ +
                fVar232) - fVar233;
      fStack_530 = (float)local_538._0_4_ * fVar232;
      fVar274 = (float)local_538._0_4_ * fVar251 + fVar274;
      fVar276 = (float)local_538._0_4_ * fVar264 + fVar276;
      local_538._0_4_ = (float)local_538._0_4_ * fVar269 + fVar283;
      fStack_530 = fStack_530 + fVar233;
      fVar213 = (fVar168 - fVar213) * fVar92 + fVar213;
      fVar249 = (fVar200 - fVar249) * fVar92 + fVar249;
      fVar262 = (fVar202 - fVar262) * fVar92 + fVar262;
      fVar263 = (fVar221 - fVar263) * fVar92 + fVar263;
      fVar213 = (fVar235 - fVar213) * fVar92 + fVar213;
      fVar249 = (fVar240 - fVar249) * fVar92 + fVar249;
      fVar262 = (fVar252 - fVar262) * fVar92 + fVar262;
      fVar263 = (fVar254 - fVar263) * fVar92 + fVar263;
      fVar168 = (((fVar278 * fVar92 + fVar224) - fVar235) * fVar92 + fVar235) - fVar213;
      fVar200 = (((fVar199 * fVar92 + fVar237) - fVar240) * fVar92 + fVar240) - fVar249;
      fVar202 = (((fVar201 * fVar92 + fVar250) - fVar252) * fVar92 + fVar252) - fVar262;
      fVar221 = (((fVar223 * fVar92 + fVar280) - fVar254) * fVar92 + fVar254) - fVar263;
      fVar213 = fVar92 * fVar168 + fVar213;
      fVar249 = fVar92 * fVar200 + fVar249;
      fVar262 = fVar92 * fVar202 + fVar262;
      fVar263 = fVar92 * fVar221 + fVar263;
      fVar92 = fVar93 * 0.33333334;
      fVar278 = fVar251 * 3.0 * fVar92 + fVar274;
      fVar199 = fVar264 * 3.0 * fVar92 + fVar276;
      fVar201 = fVar269 * 3.0 * fVar92 + (float)local_538._0_4_;
      fVar232 = fVar232 * 3.0 * fVar92 + fStack_530;
      fVar223 = fVar213 - fVar92 * fVar168 * 3.0;
      fVar224 = fVar249 - fVar92 * fVar200 * 3.0;
      fVar235 = fVar262 - fVar92 * fVar202 * 3.0;
      fVar237 = fVar263 - fVar92 * fVar221 * 3.0;
      fVar221 = (fVar262 - fVar213) + ((float)local_538._0_4_ - fVar274);
      fVar251 = (fVar263 - fVar249) + (fStack_530 - fVar276);
      auVar216._0_4_ = fVar224 * fVar251;
      auVar216._4_4_ = fVar224 * fVar251;
      auVar216._8_4_ = fVar237 * fVar251;
      auVar216._12_4_ = fVar237 * fVar251;
      fVar92 = fVar274 * fVar221 + fVar276 * fVar251;
      fVar168 = (float)local_538._0_4_ * fVar221 + fStack_530 * fVar251;
      fVar264 = fVar278 * fVar221 + fVar199 * fVar251;
      fVar269 = fVar201 * fVar221 + fVar232 * fVar251;
      fVar240 = fVar223 * fVar221 + auVar216._0_4_;
      auVar193._0_8_ = CONCAT44(fVar224 * fVar221 + auVar216._4_4_,fVar240);
      auVar193._8_4_ = fVar235 * fVar221 + auVar216._8_4_;
      auVar193._12_4_ = fVar237 * fVar221 + auVar216._12_4_;
      fVar202 = fVar221 * fVar213 + fVar251 * fVar249;
      fVar250 = fVar221 * fVar262 + fVar251 * fVar263;
      auVar12._4_8_ = auVar216._8_8_;
      auVar12._0_4_ = fVar199 * fVar221 + fVar199 * fVar251;
      auVar217._0_8_ = auVar12._0_8_ << 0x20;
      auVar217._8_4_ = fVar269;
      auVar217._12_4_ = fVar232 * fVar221 + fVar232 * fVar251;
      fVar200 = fVar264;
      if (fVar264 <= fVar92) {
        fVar200 = fVar92;
        fVar92 = fVar264;
      }
      auVar218._8_8_ = auVar217._8_8_;
      auVar218._0_8_ = auVar218._8_8_;
      auVar78._8_4_ = auVar193._8_4_;
      auVar78._0_8_ = auVar193._0_8_;
      auVar78._12_4_ = auVar193._12_4_;
      if (fVar202 <= fVar240) {
        auVar78._0_4_ = fVar202;
      }
      if (auVar78._0_4_ <= fVar92) {
        fVar92 = auVar78._0_4_;
      }
      auVar13._4_8_ = auVar78._8_8_;
      auVar13._0_4_ = fVar221 * fVar249 + fVar251 * fVar249;
      auVar79._0_8_ = auVar13._0_8_ << 0x20;
      auVar79._8_4_ = fVar250;
      auVar79._12_4_ = fVar221 * fVar263 + fVar251 * fVar263;
      if (fVar202 <= fVar240) {
        fVar202 = fVar240;
      }
      auVar80._8_8_ = auVar79._8_8_;
      auVar80._0_8_ = auVar80._8_8_;
      if (fVar202 <= fVar200) {
        fVar202 = fVar200;
      }
      if (fVar269 <= fVar168) {
        auVar218._0_4_ = fVar168;
        fVar168 = fVar269;
      }
      auVar107._8_4_ = auVar193._8_4_;
      auVar107._0_8_ = auVar193._8_8_;
      auVar107._12_4_ = auVar193._12_4_;
      if (fVar250 <= auVar193._8_4_) {
        auVar107._0_4_ = fVar250;
      }
      if (auVar107._0_4_ <= fVar168) {
        fVar168 = auVar107._0_4_;
      }
      if (fVar250 <= auVar193._8_4_) {
        auVar80._0_4_ = auVar193._8_4_;
      }
      if (auVar80._0_4_ <= auVar218._0_4_) {
        auVar80._0_4_ = auVar218._0_4_;
      }
      bVar43 = 3 < (uint)uVar42;
      uVar14 = (undefined3)(uVar49 >> 8);
      uVar38 = (ulong)CONCAT31(uVar14,bVar43);
      fVar200 = auVar80._0_4_;
      if ((0.0001 <= fVar92) || (fVar200 <= -0.0001)) break;
      goto LAB_00a92909;
    }
  } while( true );
  if ((fVar168 < 0.0001 && -0.0001 < fVar202) ||
     ((fVar92 < 0.0001 && -0.0001 < fVar202 || (fVar168 < 0.0001 && -0.0001 < fVar200)))) {
LAB_00a92909:
    bVar43 = bVar43 || fVar93 < 0.001;
    uVar38 = (ulong)CONCAT31(uVar14,bVar43);
    fVar251 = (float)(~-(uint)(fVar92 < 0.0) & 0x3f800000 | -(uint)(fVar92 < 0.0) & 0xbf800000);
    fVar264 = (float)(~-(uint)(fVar202 < 0.0) & 0x3f800000 | -(uint)(fVar202 < 0.0) & 0xbf800000);
    fVar221 = 0.0;
    if ((fVar251 == fVar264) && (!NAN(fVar251) && !NAN(fVar264))) {
      fVar221 = INFINITY;
    }
    fVar269 = 0.0;
    if ((fVar251 == fVar264) && (!NAN(fVar251) && !NAN(fVar264))) {
      fVar269 = -INFINITY;
    }
    fVar240 = (float)(~-(uint)(fVar168 < 0.0) & 0x3f800000 | -(uint)(fVar168 < 0.0) & 0xbf800000);
    if ((fVar251 != fVar240) || (fVar250 = fVar269, NAN(fVar251) || NAN(fVar240))) {
      if ((fVar168 != fVar92) || (NAN(fVar168) || NAN(fVar92))) {
        fVar168 = -fVar92 / (fVar168 - fVar92);
        fVar168 = (1.0 - fVar168) * 0.0 + fVar168;
        fVar250 = fVar168;
      }
      else {
        fVar168 = 0.0;
        if ((fVar92 != 0.0) || (fVar250 = 1.0, NAN(fVar92))) {
          fVar168 = INFINITY;
          fVar250 = -INFINITY;
        }
      }
      if (fVar168 <= fVar221) {
        fVar221 = fVar168;
      }
      if (fVar250 <= fVar269) {
        fVar250 = fVar269;
      }
    }
    fVar92 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar200 < 0.0) * 4);
    if ((fVar264 != fVar92) || (fVar168 = fVar250, NAN(fVar264) || NAN(fVar92))) {
      if ((fVar200 != fVar202) || (NAN(fVar200) || NAN(fVar202))) {
        fVar251 = -fVar202 / (fVar200 - fVar202);
        fVar251 = (1.0 - fVar251) * 0.0 + fVar251;
        fVar168 = fVar251;
      }
      else {
        fVar251 = 0.0;
        if ((fVar202 != 0.0) || (fVar168 = 1.0, NAN(fVar202))) {
          fVar251 = INFINITY;
          fVar168 = -INFINITY;
        }
      }
      if (fVar251 <= fVar221) {
        fVar221 = fVar251;
      }
      if (fVar168 <= fVar250) {
        fVar168 = fVar250;
      }
    }
    if ((fVar240 != fVar92) || (NAN(fVar240) || NAN(fVar92))) {
      fVar221 = (float)(~-(uint)(fVar221 < 1.0) & 0x3f800000 |
                       (uint)fVar221 & -(uint)(fVar221 < 1.0));
      fVar168 = (float)(~-(uint)(fVar168 < 1.0) & (uint)fVar168 |
                       -(uint)(fVar168 < 1.0) & 0x3f800000);
    }
    fVar221 = (float)(~-(uint)(fVar221 < 0.0) & (uint)fVar221);
    fVar92 = (float)(~-(uint)(fVar168 < 1.0) & 0x3f800000 | (uint)fVar168 & -(uint)(fVar168 < 1.0));
    if (fVar221 <= fVar92) {
      fVar221 = fVar221 + -0.1;
      fVar92 = fVar92 + 0.1;
      uVar48 = -(uint)(fVar92 < 1.0);
      fVar221 = (float)(~-(uint)(fVar221 < 0.0) & (uint)fVar221);
      fVar92 = (float)(~uVar48 & 0x3f800000 | (uint)fVar92 & uVar48);
      fVar240 = 1.0 - fVar221;
      fVar250 = 1.0 - fVar221;
      fVar252 = 1.0 - fVar92;
      fVar280 = 1.0 - fVar92;
      fVar168 = fVar274 * fVar240 + (float)local_538._0_4_ * fVar221;
      fVar202 = fVar276 * fVar250 + fStack_530 * fVar221;
      fVar251 = fVar274 * fVar252 + fVar212 * fVar92;
      fVar264 = fVar276 * fVar280 + fVar222 * fVar92;
      fVar269 = fVar278 * fVar240 + fVar201 * fVar221;
      fVar274 = fVar199 * fVar250 + fVar232 * fVar221;
      fVar276 = fVar278 * fVar252 + fVar201 * fVar92;
      fVar278 = fVar199 * fVar280 + fVar232 * fVar92;
      fVar199 = fVar223 * fVar240 + fVar235 * fVar221;
      fVar201 = fVar224 * fVar250 + fVar237 * fVar221;
      fVar232 = fVar223 * fVar252 + fVar235 * fVar92;
      fVar223 = fVar224 * fVar280 + fVar237 * fVar92;
      fVar224 = fVar240 * fVar213 + fVar262 * fVar221;
      fVar235 = fVar250 * fVar249 + fVar263 * fVar221;
      fVar213 = fVar252 * fVar213 + fVar262 * fVar92;
      fVar249 = fVar280 * fVar249 + fVar263 * fVar92;
      fVar262 = (float)local_538._4_4_ * (1.0 - fVar92);
      local_538._4_4_ = (float)local_538._4_4_ * (1.0 - fVar221) + fStack_52c * fVar221;
      fStack_52c = fVar262 + fStack_52c * fVar92;
      fVar93 = 1.0 / fVar93;
      auVar108._0_4_ = fVar213 - fVar224;
      auVar108._4_4_ = fVar249 - fVar235;
      auVar108._8_4_ = fVar213 - fVar213;
      auVar108._12_4_ = fVar249 - fVar249;
      auVar132._0_8_ = CONCAT44(fVar223 - fVar201,fVar232 - fVar199);
      auVar132._8_4_ = fVar232 - fVar232;
      auVar132._12_4_ = fVar223 - fVar223;
      auVar163._0_4_ = fVar276 - fVar269;
      auVar163._4_4_ = fVar278 - fVar274;
      auVar163._8_4_ = fVar276 - fVar276;
      auVar163._12_4_ = fVar278 - fVar278;
      auVar219._0_8_ = CONCAT44((fVar274 - fVar202) * 3.0,(fVar269 - fVar168) * 3.0);
      auVar219._8_4_ = (fVar276 - fVar251) * 3.0;
      auVar219._12_4_ = (fVar278 - fVar264) * 3.0;
      auVar145._0_8_ = CONCAT44((fVar201 - fVar274) * 3.0,(fVar199 - fVar269) * 3.0);
      auVar145._8_4_ = (fVar232 - fVar276) * 3.0;
      auVar145._12_4_ = (fVar223 - fVar278) * 3.0;
      auVar245._0_4_ = (fVar224 - fVar199) * 3.0;
      auVar245._4_4_ = (fVar235 - fVar201) * 3.0;
      auVar245._8_4_ = (fVar213 - fVar232) * 3.0;
      auVar245._12_4_ = (fVar249 - fVar223) * 3.0;
      auVar194._8_4_ = auVar145._8_4_;
      auVar194._0_8_ = auVar145._0_8_;
      auVar194._12_4_ = auVar145._12_4_;
      auVar157 = minps(auVar194,auVar245);
      auVar60 = maxps(auVar145,auVar245);
      auVar227._8_4_ = auVar219._8_4_;
      auVar227._0_8_ = auVar219._0_8_;
      auVar227._12_4_ = auVar219._12_4_;
      auVar121 = minps(auVar227,auVar157);
      auVar158 = maxps(auVar219,auVar60);
      auVar15._4_8_ = auVar60._8_8_;
      auVar15._0_4_ = auVar121._4_4_;
      auVar146._0_8_ = auVar15._0_8_ << 0x20;
      auVar146._8_4_ = auVar121._8_4_;
      auVar146._12_4_ = auVar121._12_4_;
      auVar147._8_8_ = auVar121._8_8_;
      auVar147._0_8_ = auVar146._8_8_;
      auVar16._4_8_ = auVar157._8_8_;
      auVar16._0_4_ = auVar158._4_4_;
      auVar195._0_8_ = auVar16._0_8_ << 0x20;
      auVar195._8_4_ = auVar158._8_4_;
      auVar195._12_4_ = auVar158._12_4_;
      auVar196._8_8_ = auVar158._8_8_;
      auVar196._0_8_ = auVar195._8_8_;
      auVar157 = minps(auVar121,auVar147);
      auVar60 = maxps(auVar158,auVar196);
      fVar240 = auVar157._0_4_ * fVar93;
      fVar250 = auVar157._4_4_ * fVar93;
      fVar252 = auVar157._8_4_ * fVar93;
      fVar280 = auVar157._12_4_ * fVar93;
      fVar274 = fVar93 * auVar60._0_4_;
      fVar276 = fVar93 * auVar60._4_4_;
      fVar199 = fVar93 * auVar60._8_4_;
      fVar93 = fVar93 * auVar60._12_4_;
      fVar235 = 1.0 / (fStack_52c - (float)local_538._4_4_);
      auVar81._0_8_ = CONCAT44(fVar264 - fVar202,fVar251 - fVar168);
      auVar81._8_4_ = fVar251 - fVar251;
      auVar81._12_4_ = fVar264 - fVar264;
      auVar206._8_4_ = auVar81._8_4_;
      auVar206._0_8_ = auVar81._0_8_;
      auVar206._12_4_ = auVar81._12_4_;
      auVar158 = minps(auVar206,auVar163);
      auVar60 = maxps(auVar81,auVar163);
      auVar127._8_4_ = auVar132._8_4_;
      auVar127._0_8_ = auVar132._0_8_;
      auVar127._12_4_ = auVar132._12_4_;
      auVar157 = minps(auVar127,auVar108);
      auVar158 = minps(auVar158,auVar157);
      auVar157 = maxps(auVar132,auVar108);
      auVar60 = maxps(auVar60,auVar157);
      fVar223 = auVar158._0_4_ * fVar235;
      fVar224 = auVar158._4_4_ * fVar235;
      fVar237 = fVar235 * auVar60._0_4_;
      fVar235 = fVar235 * auVar60._4_4_;
      auVar197._4_4_ = fStack_52c;
      auVar197._0_4_ = fStack_530;
      auVar197._8_4_ = fVar149;
      auVar197._12_4_ = fVar116;
      local_b8 = ((float)local_538._0_4_ + fStack_530) * 0.5;
      fVar263 = ((float)local_538._4_4_ + fStack_52c) * 0.5;
      fVar264 = (fStack_530 + fVar149) * 0.0;
      fVar269 = (fStack_52c + fVar116) * 0.0;
      fVar92 = local_118 * local_b8 + fVar260;
      fVar168 = fStack_114 * local_b8 + fVar261;
      fVar202 = fStack_110 * local_b8 + fVar211;
      fVar213 = fStack_10c * local_b8 + 0.0;
      fVar221 = local_128 * local_b8 + fVar169;
      fVar249 = fStack_124 * local_b8 + fVar130;
      fVar251 = fStack_120 * local_b8 + fVar134;
      fVar262 = fStack_11c * local_b8 + fVar135;
      fVar92 = (fVar221 - fVar92) * local_b8 + fVar92;
      fVar168 = (fVar249 - fVar168) * local_b8 + fVar168;
      fVar202 = (fVar251 - fVar202) * local_b8 + fVar202;
      fVar213 = (fVar262 - fVar213) * local_b8 + fVar213;
      fVar221 = (((local_138 * local_b8 + fVar253) - fVar221) * local_b8 + fVar221) - fVar92;
      fVar249 = (((fStack_134 * local_b8 + fVar255) - fVar249) * local_b8 + fVar249) - fVar168;
      fVar251 = (((fStack_130 * local_b8 + fVar234) - fVar251) * local_b8 + fVar251) - fVar202;
      fVar262 = (((fStack_12c * local_b8 + fVar239) - fVar262) * local_b8 + fVar262) - fVar213;
      fVar92 = local_b8 * fVar221 + fVar92;
      fVar168 = local_b8 * fVar249 + fVar168;
      fVar221 = fVar221 * 3.0;
      fVar249 = fVar249 * 3.0;
      fVar202 = (local_b8 * fVar251 + fVar202) - fVar92;
      fVar213 = (local_b8 * fVar262 + fVar213) - fVar168;
      fVar221 = (fVar251 * 3.0 - fVar221) * fVar263 + fVar221;
      fVar249 = (fVar262 * 3.0 - fVar249) * fVar263 + fVar249;
      auVar133._0_8_ = CONCAT44(fVar221,fVar202) ^ 0x80000000;
      auVar133._8_4_ = fVar221;
      auVar133._12_4_ = fVar221;
      fVar254 = (float)local_538._0_4_ - local_b8;
      fVar283 = (float)local_538._4_4_ - fVar263;
      fVar233 = fStack_530 - fVar264;
      fVar236 = fStack_52c - fVar269;
      fVar238 = fStack_530 - local_b8;
      fVar265 = fStack_52c - fVar263;
      fVar149 = fVar149 - fVar264;
      fVar116 = fVar116 - fVar269;
      fVar92 = fVar202 * fVar263 + fVar92;
      fVar168 = fVar213 * fVar263 + fVar168;
      auVar148._0_8_ = CONCAT44(fVar249,fVar213) ^ 0x8000000000000000;
      auVar148._8_4_ = -fVar249;
      auVar148._12_4_ = -fVar249;
      auVar82._0_4_ = fVar213 * fVar221 - fVar249 * fVar202;
      auVar82._4_4_ = auVar82._0_4_;
      auVar82._8_4_ = auVar82._0_4_;
      auVar82._12_4_ = auVar82._0_4_;
      auVar157 = divps(auVar148,auVar82);
      auVar60 = divps(auVar133,auVar82);
      fVar262 = auVar157._0_4_;
      fVar264 = auVar157._4_4_;
      fVar249 = auVar60._0_4_;
      fVar251 = auVar60._4_4_;
      local_b8 = local_b8 - (fVar168 * fVar249 + fVar92 * fVar262);
      local_a8 = fVar263 - (fVar168 * fVar251 + fVar92 * fVar264);
      fVar221 = fVar263 - (fVar168 * auVar60._8_4_ + fVar92 * auVar157._8_4_);
      fVar263 = fVar263 - (fVar168 * auVar60._12_4_ + fVar92 * auVar157._12_4_);
      auVar109._0_8_ = CONCAT44(fVar264 * fVar223,fVar264 * fVar240);
      auVar109._8_4_ = fVar264 * fVar250;
      auVar109._12_4_ = fVar264 * fVar224;
      auVar83._0_4_ = fVar264 * fVar274;
      auVar83._4_4_ = fVar264 * fVar237;
      auVar83._8_4_ = fVar264 * fVar276;
      auVar83._12_4_ = fVar264 * fVar235;
      auVar282._8_4_ = auVar109._8_4_;
      auVar282._0_8_ = auVar109._0_8_;
      auVar282._12_4_ = auVar109._12_4_;
      auVar121 = minps(auVar282,auVar83);
      auVar60 = maxps(auVar83,auVar109);
      auVar164._0_8_ = CONCAT44(fVar251 * fVar224,fVar251 * fVar250);
      auVar164._8_4_ = fVar251 * fVar252;
      auVar164._12_4_ = fVar251 * fVar280;
      auVar110._0_4_ = fVar251 * fVar276;
      auVar110._4_4_ = fVar251 * fVar235;
      auVar110._8_4_ = fVar251 * fVar199;
      auVar110._12_4_ = fVar251 * fVar93;
      auVar228._8_4_ = auVar164._8_4_;
      auVar228._0_8_ = auVar164._0_8_;
      auVar228._12_4_ = auVar164._12_4_;
      auVar158 = minps(auVar228,auVar110);
      auVar157 = maxps(auVar110,auVar164);
      fVar92 = 0.0 - (auVar157._0_4_ + auVar60._0_4_);
      fVar168 = 1.0 - (auVar157._4_4_ + auVar60._4_4_);
      fVar202 = 0.0 - (auVar157._8_4_ + auVar60._8_4_);
      fVar213 = 0.0 - (auVar157._12_4_ + auVar60._12_4_);
      fVar269 = 0.0 - (auVar158._0_4_ + auVar121._0_4_);
      fVar278 = 1.0 - (auVar158._4_4_ + auVar121._4_4_);
      fVar201 = 0.0 - (auVar158._8_4_ + auVar121._8_4_);
      fVar232 = 0.0 - (auVar158._12_4_ + auVar121._12_4_);
      auVar111._0_8_ = CONCAT44(fVar283 * fVar168,fVar254 * fVar92);
      auVar111._8_4_ = fVar233 * fVar202;
      auVar111._12_4_ = fVar236 * fVar213;
      auVar246._0_8_ = CONCAT44(fVar223 * fVar262,fVar240 * fVar262);
      auVar246._8_4_ = fVar250 * fVar262;
      auVar246._12_4_ = fVar224 * fVar262;
      auVar165._0_4_ = fVar262 * fVar274;
      auVar165._4_4_ = fVar262 * fVar237;
      auVar165._8_4_ = fVar262 * fVar276;
      auVar165._12_4_ = fVar262 * fVar235;
      auVar229._8_4_ = auVar246._8_4_;
      auVar229._0_8_ = auVar246._0_8_;
      auVar229._12_4_ = auVar246._12_4_;
      auVar157 = minps(auVar229,auVar165);
      auVar60 = maxps(auVar165,auVar246);
      auVar207._0_8_ = CONCAT44(fVar224 * fVar249,fVar250 * fVar249);
      auVar207._8_4_ = fVar252 * fVar249;
      auVar207._12_4_ = fVar280 * fVar249;
      auVar247._0_4_ = fVar249 * fVar276;
      auVar247._4_4_ = fVar249 * fVar235;
      auVar247._8_4_ = fVar249 * fVar199;
      auVar247._12_4_ = fVar249 * fVar93;
      auVar273._8_4_ = auVar207._8_4_;
      auVar273._0_8_ = auVar207._0_8_;
      auVar273._12_4_ = auVar207._12_4_;
      auVar121 = minps(auVar273,auVar247);
      auVar230._0_4_ = fVar254 * fVar269;
      auVar230._4_4_ = fVar283 * fVar278;
      auVar230._8_4_ = fVar233 * fVar201;
      auVar230._12_4_ = fVar236 * fVar232;
      auVar84._0_8_ = CONCAT44(fVar168 * fVar265,fVar92 * fVar238);
      auVar84._8_4_ = fVar202 * fVar149;
      auVar84._12_4_ = fVar213 * fVar116;
      auVar173._0_4_ = fVar269 * fVar238;
      auVar173._4_4_ = fVar278 * fVar265;
      auVar173._8_4_ = fVar201 * fVar149;
      auVar173._12_4_ = fVar232 * fVar116;
      auVar158 = maxps(auVar247,auVar207);
      fVar92 = 1.0 - (auVar158._0_4_ + auVar60._0_4_);
      fVar93 = 0.0 - (auVar158._4_4_ + auVar60._4_4_);
      fVar168 = 0.0 - (auVar158._8_4_ + auVar60._8_4_);
      fVar202 = 0.0 - (auVar158._12_4_ + auVar60._12_4_);
      fVar213 = 1.0 - (auVar121._0_4_ + auVar157._0_4_);
      fVar269 = 0.0 - (auVar121._4_4_ + auVar157._4_4_);
      fVar274 = 0.0 - (auVar121._8_4_ + auVar157._8_4_);
      fVar276 = 0.0 - (auVar121._12_4_ + auVar157._12_4_);
      auVar208._0_8_ = CONCAT44(fVar283 * fVar93,fVar254 * fVar92);
      auVar208._8_4_ = fVar233 * fVar168;
      auVar208._12_4_ = fVar236 * fVar202;
      auVar259._0_4_ = fVar254 * fVar213;
      auVar259._4_4_ = fVar283 * fVar269;
      auVar259._8_4_ = fVar233 * fVar274;
      auVar259._12_4_ = fVar236 * fVar276;
      auVar166._0_8_ = CONCAT44(fVar93 * fVar265,fVar92 * fVar238);
      auVar166._8_4_ = fVar168 * fVar149;
      auVar166._12_4_ = fVar202 * fVar116;
      auVar220._0_4_ = fVar213 * fVar238;
      auVar220._4_4_ = fVar269 * fVar265;
      auVar220._8_4_ = fVar274 * fVar149;
      auVar220._12_4_ = fVar276 * fVar116;
      auVar248._8_4_ = auVar208._8_4_;
      auVar248._0_8_ = auVar208._0_8_;
      auVar248._12_4_ = auVar208._12_4_;
      auVar60 = minps(auVar248,auVar259);
      auVar268._8_4_ = auVar166._8_4_;
      auVar268._0_8_ = auVar166._0_8_;
      auVar268._12_4_ = auVar166._12_4_;
      auVar157 = minps(auVar268,auVar220);
      auVar215 = minps(auVar60,auVar157);
      auVar157 = maxps(auVar259,auVar208);
      auVar60 = maxps(auVar220,auVar166);
      auVar158 = maxps(auVar60,auVar157);
      auVar209._8_4_ = auVar111._8_4_;
      auVar209._0_8_ = auVar111._0_8_;
      auVar209._12_4_ = auVar111._12_4_;
      auVar157 = minps(auVar209,auVar230);
      auVar167._8_4_ = auVar84._8_4_;
      auVar167._0_8_ = auVar84._0_8_;
      auVar167._12_4_ = auVar84._12_4_;
      auVar60 = minps(auVar167,auVar173);
      auVar157 = minps(auVar157,auVar60);
      auVar121 = maxps(auVar230,auVar111);
      auVar60 = maxps(auVar173,auVar84);
      auVar60 = maxps(auVar60,auVar121);
      auVar210._0_4_ = auVar215._4_4_ + auVar215._0_4_ + local_b8;
      auVar210._4_4_ = auVar157._4_4_ + auVar157._0_4_ + local_a8;
      auVar210._8_4_ = auVar215._8_4_ + auVar215._4_4_ + fVar221;
      auVar210._12_4_ = auVar215._12_4_ + auVar157._4_4_ + fVar263;
      fVar92 = auVar158._4_4_ + auVar158._0_4_ + local_b8;
      fVar93 = auVar60._4_4_ + auVar60._0_4_ + local_a8;
      auVar85._4_4_ = fVar93;
      auVar85._0_4_ = fVar92;
      auVar157 = maxps(_local_538,auVar210);
      auVar85._8_4_ = auVar158._8_4_ + auVar158._4_4_ + fVar221;
      auVar85._12_4_ = auVar158._12_4_ + auVar60._4_4_ + fVar263;
      auVar60 = minps(auVar85,auVar197);
      iVar45 = -(uint)(auVar60._0_4_ < auVar157._0_4_);
      iVar47 = -(uint)(auVar60._4_4_ < auVar157._4_4_);
      auVar87._4_4_ = iVar47;
      auVar87._0_4_ = iVar45;
      auVar87._8_4_ = iVar47;
      auVar87._12_4_ = iVar47;
      auVar86._8_8_ = auVar87._8_8_;
      auVar86._4_4_ = iVar45;
      auVar86._0_4_ = iVar45;
      iVar45 = movmskpd((uint)(fVar200 < 0.0),auVar86);
      if (iVar45 == 0) {
        bVar36 = 0;
        if (((float)local_538._0_4_ < auVar210._0_4_) && (fVar92 < fStack_530)) {
          bVar36 = -(fVar93 < fStack_52c) & (float)local_538._4_4_ < auVar210._4_4_;
        }
        bVar36 = bVar43 | bVar36;
        uVar38 = (ulong)CONCAT31(uVar14,bVar36);
        fVar92 = fStack_530;
        if (bVar36 != 1) goto LAB_00a91f33;
        uVar38 = 200;
        do {
          fVar93 = 1.0 - local_b8;
          fVar168 = local_b8 * local_b8 * local_b8;
          fVar149 = local_b8 * local_b8 * 3.0 * fVar93;
          fVar92 = fVar93 * fVar93 * fVar93;
          fVar200 = local_b8 * 3.0 * fVar93 * fVar93;
          fVar93 = fVar92 * fVar260 + fVar200 * fVar169 + fVar149 * fVar253 + fVar168 * fVar174;
          fVar116 = fVar92 * fVar261 + fVar200 * fVar130 + fVar149 * fVar255 + fVar168 * fVar175;
          fVar93 = ((fVar92 * fVar211 + fVar200 * fVar134 + fVar149 * fVar234 + fVar168 * fVar52) -
                   fVar93) * local_a8 + fVar93;
          fVar116 = ((fVar92 * 0.0 + fVar200 * fVar135 + fVar149 * fVar239 + fVar168 * fVar51) -
                    fVar116) * local_a8 + fVar116;
          local_b8 = local_b8 - (fVar116 * fVar249 + fVar93 * fVar262);
          local_a8 = local_a8 - (fVar116 * fVar251 + fVar93 * fVar264);
          fVar92 = ABS(fVar116);
          if (ABS(fVar116) <= ABS(fVar93)) {
            fVar92 = ABS(fVar93);
          }
          if (fVar92 < fVar129) {
            if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) && (0.0 <= local_a8)) && (local_a8 <= 1.0)
               ) {
              fVar92 = (pLVar35->vx).field_0.m128[2];
              fVar93 = (pLVar35->vy).field_0.m128[2];
              fVar116 = (pLVar35->vz).field_0.m128[2];
              fVar221 = 1.0 - local_a8;
              fVar213 = 1.0 - local_b8;
              fVar149 = fVar213 * fVar213 * fVar213;
              fVar168 = local_b8 * 3.0 * fVar213 * fVar213;
              fVar202 = local_b8 * local_b8 * local_b8;
              fVar200 = local_b8 * local_b8 * 3.0 * fVar213;
              fVar92 = ((fStack_140 * fVar116 + fStack_144 * fVar93 + local_148 * fVar92) * fVar221
                       + (fStack_180 * fVar116 + fStack_184 * fVar93 + local_188 * fVar92) *
                         local_a8) * fVar149 +
                       ((fStack_150 * fVar116 + fStack_154 * fVar93 + local_158 * fVar92) * fVar221
                       + (fStack_190 * fVar116 + fStack_194 * fVar93 + local_198 * fVar92) *
                         local_a8) * fVar168 +
                       ((fStack_160 * fVar116 + fStack_164 * fVar93 + local_168 * fVar92) * fVar221
                       + (fStack_1a0 * fVar116 + fStack_1a4 * fVar93 + local_1a8 * fVar92) *
                         local_a8) * fVar200 +
                       (fVar221 * (fStack_170 * fVar116 + fStack_174 * fVar93 + local_178 * fVar92)
                       + (fVar116 * fStack_1b0 + fVar93 * fStack_1b4 + fVar92 * local_1b8) *
                         local_a8) * fVar202;
              if ((fVar91 <= fVar92) && (fVar93 = *(float *)(ray + k * 4 + 0x80), fVar92 <= fVar93))
              {
                fVar251 = 1.0 - local_a8;
                fVar262 = 1.0 - local_a8;
                fVar263 = 1.0 - local_a8;
                fVar116 = local_368 * fVar251 + local_278 * local_a8;
                fVar221 = fStack_364 * fVar262 + fStack_274 * local_a8;
                fVar249 = fStack_360 * fVar263 + fStack_270 * local_a8;
                fVar264 = local_388 * fVar251 + fVar117 * local_a8;
                fVar274 = fStack_384 * fVar262 + fVar128 * local_a8;
                fVar278 = fStack_380 * fVar263 + fVar136 * local_a8;
                fVar269 = fVar264 - fVar116;
                fVar276 = fVar274 - fVar221;
                fVar199 = fVar278 - fVar249;
                fVar116 = (((fVar116 - (local_358 * fVar251 + fVar94 * local_a8)) * fVar213 +
                           local_b8 * fVar269) * fVar213 +
                          (fVar269 * fVar213 +
                          ((fVar251 * local_378 + fVar150 * local_a8) - fVar264) * local_b8) *
                          local_b8) * 3.0;
                fVar221 = (((fVar221 - (fStack_354 * fVar262 + fVar95 * local_a8)) * fVar213 +
                           local_b8 * fVar276) * fVar213 +
                          (fVar276 * fVar213 +
                          ((fVar262 * fStack_374 + fVar170 * local_a8) - fVar274) * local_b8) *
                          local_b8) * 3.0;
                fVar213 = (((fVar249 - (fStack_350 * fVar263 + fVar115 * local_a8)) * fVar213 +
                           local_b8 * fVar199) * fVar213 +
                          (fVar199 * fVar213 +
                          ((fVar263 * fStack_370 + fVar151 * local_a8) - fVar278) * local_b8) *
                          local_b8) * 3.0;
                pGVar6 = (context->scene->geometries).items[uVar44].ptr;
                uVar38 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar249 = fVar149 * local_288 +
                            fVar168 * local_298 + fVar200 * local_2a8 + fVar202 * local_2b8;
                  fVar251 = fVar149 * fStack_284 +
                            fVar168 * fStack_294 + fVar200 * fStack_2a4 + fVar202 * fStack_2b4;
                  fVar149 = fVar149 * fStack_280 +
                            fVar168 * fStack_290 + fVar200 * fStack_2a0 + fVar202 * fStack_2b0;
                  local_c8 = fVar251 * fVar116 - fVar221 * fVar249;
                  local_e8 = fVar149 * fVar221 - fVar213 * fVar251;
                  local_d8 = fVar249 * fVar213 - fVar116 * fVar149;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar92;
                    *(float *)(ray + k * 4 + 0xc0) = local_e8;
                    *(float *)(ray + k * 4 + 0xd0) = local_d8;
                    *(float *)(ray + k * 4 + 0xe0) = local_c8;
                    *(float *)(ray + k * 4 + 0xf0) = local_b8;
                    *(float *)(ray + k * 4 + 0x100) = local_a8;
                    *(uint *)(ray + k * 4 + 0x110) = uVar46;
                    *(uint *)(ray + k * 4 + 0x120) = uVar44;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar48 = context->user->instPrimID[0];
                    uVar38 = (ulong)uVar48;
                    *(uint *)(ray + k * 4 + 0x140) = uVar48;
                  }
                  else {
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    fStack_c4 = local_c8;
                    fStack_c0 = local_c8;
                    fStack_bc = local_c8;
                    fStack_b4 = local_b8;
                    fStack_b0 = local_b8;
                    fStack_ac = local_b8;
                    fStack_a4 = local_a8;
                    fStack_a0 = local_a8;
                    fStack_9c = local_a8;
                    local_98 = CONCAT44(uStack_2e4,local_2e8);
                    uStack_90 = CONCAT44(uStack_2dc,uStack_2e0);
                    local_88 = CONCAT44(uStack_2d4,local_2d8);
                    uStack_80 = CONCAT44(uStack_2cc,uStack_2d0);
                    local_78 = context->user->instID[0];
                    uStack_74 = local_78;
                    uStack_70 = local_78;
                    uStack_6c = local_78;
                    local_68 = context->user->instPrimID[0];
                    uStack_64 = local_68;
                    uStack_60 = local_68;
                    uStack_5c = local_68;
                    *(float *)(ray + k * 4 + 0x80) = fVar92;
                    local_3e8 = *local_3d0;
                    local_3b8.valid = (int *)local_3e8;
                    local_3b8.geometryUserPtr = pGVar6->userPtr;
                    local_3b8.context = context->user;
                    local_3b8.hit = (RTCHitN *)&local_e8;
                    local_3b8.N = 4;
                    p_Var39 = pGVar6->intersectionFilterN;
                    local_3b8.ray = (RTCRayN *)ray;
                    if (p_Var39 != (RTCFilterFunctionN)0x0) {
                      p_Var39 = (RTCFilterFunctionN)(*p_Var39)(&local_3b8);
                    }
                    auVar112._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                    auVar112._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                    auVar112._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                    auVar112._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                    uVar48 = movmskps((int)p_Var39,auVar112);
                    pRVar40 = (RayHitK<4> *)(ulong)(uVar48 ^ 0xf);
                    if ((uVar48 ^ 0xf) == 0) {
                      auVar112 = auVar112 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var39 = context->args->filter;
                      if ((p_Var39 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        p_Var39 = (RTCFilterFunctionN)(*p_Var39)(&local_3b8);
                      }
                      auVar88._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                      auVar88._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                      auVar88._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                      auVar88._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                      auVar112 = auVar88 ^ _DAT_01f7ae20;
                      uVar48 = movmskps((int)p_Var39,auVar88);
                      pRVar40 = (RayHitK<4> *)(ulong)(uVar48 ^ 0xf);
                      if ((uVar48 ^ 0xf) != 0) {
                        fVar92 = *(float *)(local_3b8.hit + 4);
                        fVar116 = *(float *)(local_3b8.hit + 8);
                        fVar149 = *(float *)(local_3b8.hit + 0xc);
                        *(uint *)(local_3b8.ray + 0xc0) =
                             ~auVar88._0_4_ & (uint)*(float *)local_3b8.hit |
                             *(uint *)(local_3b8.ray + 0xc0) & auVar88._0_4_;
                        *(uint *)(local_3b8.ray + 0xc4) =
                             ~auVar88._4_4_ & (uint)fVar92 |
                             *(uint *)(local_3b8.ray + 0xc4) & auVar88._4_4_;
                        *(uint *)(local_3b8.ray + 200) =
                             ~auVar88._8_4_ & (uint)fVar116 |
                             *(uint *)(local_3b8.ray + 200) & auVar88._8_4_;
                        *(uint *)(local_3b8.ray + 0xcc) =
                             ~auVar88._12_4_ & (uint)fVar149 |
                             *(uint *)(local_3b8.ray + 0xcc) & auVar88._12_4_;
                        fVar92 = *(float *)(local_3b8.hit + 0x14);
                        fVar116 = *(float *)(local_3b8.hit + 0x18);
                        fVar149 = *(float *)(local_3b8.hit + 0x1c);
                        *(uint *)(local_3b8.ray + 0xd0) =
                             ~auVar88._0_4_ & (uint)*(float *)(local_3b8.hit + 0x10) |
                             *(uint *)(local_3b8.ray + 0xd0) & auVar88._0_4_;
                        *(uint *)(local_3b8.ray + 0xd4) =
                             ~auVar88._4_4_ & (uint)fVar92 |
                             *(uint *)(local_3b8.ray + 0xd4) & auVar88._4_4_;
                        *(uint *)(local_3b8.ray + 0xd8) =
                             ~auVar88._8_4_ & (uint)fVar116 |
                             *(uint *)(local_3b8.ray + 0xd8) & auVar88._8_4_;
                        *(uint *)(local_3b8.ray + 0xdc) =
                             ~auVar88._12_4_ & (uint)fVar149 |
                             *(uint *)(local_3b8.ray + 0xdc) & auVar88._12_4_;
                        fVar92 = *(float *)(local_3b8.hit + 0x24);
                        fVar116 = *(float *)(local_3b8.hit + 0x28);
                        fVar149 = *(float *)(local_3b8.hit + 0x2c);
                        *(uint *)(local_3b8.ray + 0xe0) =
                             ~auVar88._0_4_ & (uint)*(float *)(local_3b8.hit + 0x20) |
                             *(uint *)(local_3b8.ray + 0xe0) & auVar88._0_4_;
                        *(uint *)(local_3b8.ray + 0xe4) =
                             ~auVar88._4_4_ & (uint)fVar92 |
                             *(uint *)(local_3b8.ray + 0xe4) & auVar88._4_4_;
                        *(uint *)(local_3b8.ray + 0xe8) =
                             ~auVar88._8_4_ & (uint)fVar116 |
                             *(uint *)(local_3b8.ray + 0xe8) & auVar88._8_4_;
                        *(uint *)(local_3b8.ray + 0xec) =
                             ~auVar88._12_4_ & (uint)fVar149 |
                             *(uint *)(local_3b8.ray + 0xec) & auVar88._12_4_;
                        fVar92 = *(float *)(local_3b8.hit + 0x34);
                        fVar116 = *(float *)(local_3b8.hit + 0x38);
                        fVar149 = *(float *)(local_3b8.hit + 0x3c);
                        *(uint *)(local_3b8.ray + 0xf0) =
                             ~auVar88._0_4_ & (uint)*(float *)(local_3b8.hit + 0x30) |
                             *(uint *)(local_3b8.ray + 0xf0) & auVar88._0_4_;
                        *(uint *)(local_3b8.ray + 0xf4) =
                             ~auVar88._4_4_ & (uint)fVar92 |
                             *(uint *)(local_3b8.ray + 0xf4) & auVar88._4_4_;
                        *(uint *)(local_3b8.ray + 0xf8) =
                             ~auVar88._8_4_ & (uint)fVar116 |
                             *(uint *)(local_3b8.ray + 0xf8) & auVar88._8_4_;
                        *(uint *)(local_3b8.ray + 0xfc) =
                             ~auVar88._12_4_ & (uint)fVar149 |
                             *(uint *)(local_3b8.ray + 0xfc) & auVar88._12_4_;
                        fVar92 = *(float *)(local_3b8.hit + 0x44);
                        fVar116 = *(float *)(local_3b8.hit + 0x48);
                        fVar149 = *(float *)(local_3b8.hit + 0x4c);
                        *(uint *)(local_3b8.ray + 0x100) =
                             ~auVar88._0_4_ & (uint)*(float *)(local_3b8.hit + 0x40) |
                             *(uint *)(local_3b8.ray + 0x100) & auVar88._0_4_;
                        *(uint *)(local_3b8.ray + 0x104) =
                             ~auVar88._4_4_ & (uint)fVar92 |
                             *(uint *)(local_3b8.ray + 0x104) & auVar88._4_4_;
                        *(uint *)(local_3b8.ray + 0x108) =
                             ~auVar88._8_4_ & (uint)fVar116 |
                             *(uint *)(local_3b8.ray + 0x108) & auVar88._8_4_;
                        *(uint *)(local_3b8.ray + 0x10c) =
                             ~auVar88._12_4_ & (uint)fVar149 |
                             *(uint *)(local_3b8.ray + 0x10c) & auVar88._12_4_;
                        fVar92 = *(float *)(local_3b8.hit + 0x54);
                        fVar116 = *(float *)(local_3b8.hit + 0x58);
                        fVar149 = *(float *)(local_3b8.hit + 0x5c);
                        *(uint *)(local_3b8.ray + 0x110) =
                             *(uint *)(local_3b8.ray + 0x110) & auVar88._0_4_ |
                             ~auVar88._0_4_ & (uint)*(float *)(local_3b8.hit + 0x50);
                        *(uint *)(local_3b8.ray + 0x114) =
                             *(uint *)(local_3b8.ray + 0x114) & auVar88._4_4_ |
                             ~auVar88._4_4_ & (uint)fVar92;
                        *(uint *)(local_3b8.ray + 0x118) =
                             *(uint *)(local_3b8.ray + 0x118) & auVar88._8_4_ |
                             ~auVar88._8_4_ & (uint)fVar116;
                        *(uint *)(local_3b8.ray + 0x11c) =
                             *(uint *)(local_3b8.ray + 0x11c) & auVar88._12_4_ |
                             ~auVar88._12_4_ & (uint)fVar149;
                        fVar92 = *(float *)(local_3b8.hit + 100);
                        fVar116 = *(float *)(local_3b8.hit + 0x68);
                        fVar149 = *(float *)(local_3b8.hit + 0x6c);
                        *(uint *)(local_3b8.ray + 0x120) =
                             *(uint *)(local_3b8.ray + 0x120) & auVar88._0_4_ |
                             ~auVar88._0_4_ & (uint)*(float *)(local_3b8.hit + 0x60);
                        *(uint *)(local_3b8.ray + 0x124) =
                             *(uint *)(local_3b8.ray + 0x124) & auVar88._4_4_ |
                             ~auVar88._4_4_ & (uint)fVar92;
                        *(uint *)(local_3b8.ray + 0x128) =
                             *(uint *)(local_3b8.ray + 0x128) & auVar88._8_4_ |
                             ~auVar88._8_4_ & (uint)fVar116;
                        *(uint *)(local_3b8.ray + 300) =
                             *(uint *)(local_3b8.ray + 300) & auVar88._12_4_ |
                             ~auVar88._12_4_ & (uint)fVar149;
                        fVar92 = *(float *)(local_3b8.hit + 0x74);
                        fVar116 = *(float *)(local_3b8.hit + 0x78);
                        fVar149 = *(float *)(local_3b8.hit + 0x7c);
                        *(uint *)(local_3b8.ray + 0x130) =
                             ~auVar88._0_4_ & (uint)*(float *)(local_3b8.hit + 0x70) |
                             *(uint *)(local_3b8.ray + 0x130) & auVar88._0_4_;
                        *(uint *)(local_3b8.ray + 0x134) =
                             ~auVar88._4_4_ & (uint)fVar92 |
                             *(uint *)(local_3b8.ray + 0x134) & auVar88._4_4_;
                        *(uint *)(local_3b8.ray + 0x138) =
                             ~auVar88._8_4_ & (uint)fVar116 |
                             *(uint *)(local_3b8.ray + 0x138) & auVar88._8_4_;
                        *(uint *)(local_3b8.ray + 0x13c) =
                             ~auVar88._12_4_ & (uint)fVar149 |
                             *(uint *)(local_3b8.ray + 0x13c) & auVar88._12_4_;
                        *(undefined1 (*) [16])(local_3b8.ray + 0x140) =
                             ~auVar88 & *(undefined1 (*) [16])(local_3b8.hit + 0x80) |
                             *(undefined1 (*) [16])(local_3b8.ray + 0x140) & auVar88;
                        pRVar40 = (RayHitK<4> *)local_3b8.ray;
                      }
                    }
                    auVar113._0_4_ = auVar112._0_4_ << 0x1f;
                    auVar113._4_4_ = auVar112._4_4_ << 0x1f;
                    auVar113._8_4_ = auVar112._8_4_ << 0x1f;
                    auVar113._12_4_ = auVar112._12_4_ << 0x1f;
                    uVar48 = movmskps((int)pRVar40,auVar113);
                    uVar38 = (ulong)uVar48;
                    if (uVar48 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar93;
                    }
                  }
                }
              }
            }
            break;
          }
          uVar38 = uVar38 - 1;
        } while (uVar38 != 0);
      }
    }
  }
  goto LAB_00a925a0;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }